

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(NodeRecordMB4D *__return_storage_ptr__,
         BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
         *this,BuildRecord *current,CachedAllocator alloc,bool toplevel)

{
  SetMB *set;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  char *pcVar3;
  BBox1f BVar4;
  byte bVar5;
  BBox1f BVar6;
  BBox1f BVar7;
  anon_class_16_2_aeee9775_conflict *paVar8;
  anon_class_1_0_00000001 *ptr;
  MemoryMonitorInterface *pMVar9;
  ThreadLocal2 *pTVar10;
  iterator iVar11;
  BBox1f *pBVar12;
  Split *pSVar13;
  Split *pSVar14;
  vint *pvVar15;
  undefined4 uVar16;
  size_t sVar17;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  uVar20;
  undefined8 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  BBox1f BVar36;
  BBox1f BVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  BBox1f BVar52;
  BBox1f BVar53;
  BBox1f BVar54;
  BBox1f BVar55;
  BBox1f BVar56;
  char cVar57;
  long *plVar58;
  MutexSys *pMVar59;
  ulong uVar60;
  void *pvVar61;
  float *pfVar62;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var63;
  size_t sVar64;
  runtime_error *prVar65;
  long lVar66;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar67;
  BBox1f *pBVar68;
  unsigned_long uVar69;
  size_t begin;
  ulong uVar70;
  SetMB *set_00;
  undefined8 uVar71;
  char *pcVar72;
  ulong uVar73;
  size_t end;
  bool bVar74;
  uint uVar75;
  uint uVar76;
  undefined1 auVar77 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  undefined1 auVar90 [16];
  float fVar91;
  BuildRecord *context;
  BuildRecord *pBVar92;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector_1;
  undefined1 local_1ac8 [16];
  undefined1 local_1ab8 [16];
  undefined1 local_1a98 [16];
  undefined1 local_1a88 [16];
  BBox1f time_range1_1;
  BBox1f time_range0_1;
  anon_class_24_3_c5d13451 isLeft;
  undefined8 uStack_1a50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a28;
  BBox1f local_1a18;
  char acStack_1a10 [8];
  BBox1f local_1a08;
  Split *pSStack_1a00;
  BBox1f local_19f8;
  BBox1f BStack_19f0;
  undefined4 local_19e8;
  undefined4 uStack_19e4;
  undefined4 uStack_19e0;
  undefined4 uStack_19dc;
  BBox1f local_19d8;
  BBox1f BStack_19d0;
  BBox1f local_19c8;
  PrimRefVector lprims_1;
  PrimRefVector lprims;
  undefined8 local_1988;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1980;
  undefined1 auStack_1970 [8];
  anon_class_1_0_00000001 reduction;
  BBox1f BStack_1900;
  vbool vSplitMask;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18c8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18b8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1898;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  BBox1f local_1878;
  BBox1f BStack_1870;
  float local_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  vint vSplitPos;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1828;
  intrusive_list_node *local_1818;
  intrusive_list_node *piStack_1810;
  atomic<tbb::detail::r1::tbb_exception_ptr_*> local_1808;
  void *pvStack_1800;
  string_resource_index local_17f8;
  char acStack_17f0 [24];
  BBox1f local_17d8;
  Split *pSStack_17d0;
  BBox1f local_17c8;
  BBox1f BStack_17c0;
  float local_17b8;
  float fStack_17b4;
  undefined4 uStack_17b0;
  undefined4 uStack_17ac;
  undefined8 local_17a8;
  float fStack_17a0;
  float fStack_179c;
  BBox1f local_1798;
  BBox1f time_range1;
  anon_class_1_0_00000001 reduction2;
  undefined4 uStack_1744;
  anon_class_1_0_00000001 reduction2_1;
  float fStack_16ac;
  undefined1 local_1698 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1678;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1668;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1658;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1648;
  BBox1f local_1638;
  Split *pSStack_1630;
  BBox1f local_1628;
  BBox1f BStack_1620;
  BBox1f local_1618;
  BBox1f BStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  BBox1f local_15f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_15e8;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  BBox1f local_1598;
  Split *pSStack_1590;
  BBox1f local_1588;
  BBox1f BStack_1580;
  BBox1f local_1578;
  BBox1f BStack_1570;
  BBox1f local_1568;
  undefined8 uStack_1560;
  BBox1f local_1558;
  vint vSplitPos_1;
  BBox1f time_range0;
  anon_union_4_2_620955e9_for_BinSplit<32UL>_3 local_14c0;
  float fStack_14bc;
  Split csplit;
  NodeRecordMB4D values [16];
  Lock<embree::MutexSys> lock;
  undefined1 local_db8 [8];
  float afStack_db0 [2];
  undefined1 local_da8 [8];
  float afStack_da0 [2];
  undefined1 local_d98 [8];
  float afStack_d90 [2];
  undefined1 local_d88 [8];
  float afStack_d80 [2];
  undefined1 local_d78 [8];
  float afStack_d70 [2];
  BBox1f local_d68;
  Split *pSStack_d60;
  BBox1f local_d58 [2];
  float local_d48 [2];
  undefined8 uStack_d40;
  BBox1f local_d38;
  BBox1f BStack_d30;
  float fStack_d2c;
  BBox1f local_d28 [332];
  BBox1f *local_2c8 [16];
  ulong local_248;
  BBox1f local_240;
  long local_238;
  BBox1f local_230;
  undefined8 local_228;
  long local_40;
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc).super_Create.allocator;
    plVar58 = (long *)__tls_get_addr(&PTR_02224d38);
    pMVar59 = (MutexSys *)*plVar58;
    if (pMVar59 == (MutexSys *)0x0) {
      pMVar59 = (MutexSys *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys(pMVar59);
      pMVar59[1].mutex = (void *)0x0;
      pMVar59[8].mutex = pMVar59;
      pMVar59[9].mutex = (void *)0x0;
      pMVar59[10].mutex = (void *)0x0;
      pMVar59[0xb].mutex = (void *)0x0;
      pMVar59[0xc].mutex = (void *)0x0;
      pMVar59[0xd].mutex = (void *)0x0;
      pMVar59[0xe].mutex = (void *)0x0;
      pMVar59[0x10].mutex = pMVar59;
      pMVar59[0x11].mutex = (void *)0x0;
      pMVar59[0x12].mutex = (void *)0x0;
      pMVar59[0x13].mutex = (void *)0x0;
      pMVar59[0x14].mutex = (void *)0x0;
      pMVar59[0x15].mutex = (void *)0x0;
      pMVar59[0x16].mutex = (void *)0x0;
      *plVar58 = (long)pMVar59;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      values[0].ref.ptr = (size_t)pMVar59;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)values);
      if (values[0].ref.ptr != 0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)values,
                   (ThreadLocal2 *)values[0].ref.ptr);
      }
      if (lock.locked == true) {
        MutexSys::unlock(lock.mutex);
      }
    }
    alloc.talloc0 = (ThreadLocal *)(pMVar59 + 8);
    alloc.talloc1 = (ThreadLocal *)(pMVar59 + 0x10);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  context = current;
  if ((toplevel) &&
     (uVar60 = (current->prims).super_PrimInfoMB.object_range._end -
               (current->prims).super_PrimInfoMB.object_range._begin,
     uVar60 <= (this->cfg).singleThreadThreshold)) {
    auVar77._8_4_ = (int)(uVar60 >> 0x20);
    auVar77._0_8_ = uVar60;
    auVar77._12_4_ = 0x45300000;
    Scene::progressMonitor
              ((this->progressMonitor).scene,
               (auVar77._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar60) - 4503599627370496.0));
  }
  set = &current->prims;
  find(&csplit,this,set);
  bVar5 = (byte)(this->cfg).logBlockSize;
  BVar6 = (BBox1f)(current->prims).super_PrimInfoMB.object_range._end;
  BVar7 = (BBox1f)(current->prims).super_PrimInfoMB.object_range._begin;
  uVar60 = (long)BVar6 - (long)BVar7;
  if (((uVar60 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) ||
     ((fVar89 = (current->prims).super_PrimInfoMB.time_range.lower,
      uVar60 <= (this->cfg).maxLeafSize &&
      (fVar78 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.upper.field_0.m128[1] -
                (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.lower.field_0.m128[1],
      fVar79 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.upper.field_0.m128[2] -
               (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.lower.field_0.m128[2],
      fVar80 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper.field_0.m128[1] -
               (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.lower.field_0.m128[1],
      fVar81 = (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper.field_0.m128[2] -
               (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.lower.field_0.m128[2],
      fVar79 = ((fVar80 + fVar81) *
                ((current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds1.upper.field_0.m128[0] -
                (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.lower.field_0.m128[0]) + fVar81 * fVar80 +
               (fVar78 + fVar79) *
               ((current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.upper.field_0.m128[0] -
               (current->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.lower.field_0.m128[0]) + fVar79 * fVar78) * 0.5 *
               ((current->prims).super_PrimInfoMB.time_range.upper - fVar89),
      fVar78 = (this->cfg).intCost,
      (float)(~(-1L << (bVar5 & 0x3f)) + (current->prims).super_PrimInfoMB.num_time_segments >>
             (bVar5 & 0x3f)) * fVar79 * fVar78 <=
      fVar79 * (this->cfg).travCost + fVar78 * csplit.sah)))) {
    SetMB::deterministic_order(set);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,current,alloc_00);
    return __return_storage_ptr__;
  }
  if (csplit.data == 0) {
    lock.mutex = (MutexSys *)0x7f8000007f800000;
    lock.locked = false;
    lock._9_7_ = 0x7f8000007f8000;
    local_db8 = (undefined1  [8])0xff800000ff800000;
    afStack_db0[0] = -INFINITY;
    afStack_db0[1] = -INFINITY;
    local_da8 = (undefined1  [8])0x7f8000007f800000;
    afStack_da0[0] = INFINITY;
    afStack_da0[1] = INFINITY;
    local_d98 = (undefined1  [8])0xff800000ff800000;
    afStack_d90[0] = -INFINITY;
    afStack_d90[1] = -INFINITY;
    local_d88 = (undefined1  [8])0x7f8000007f800000;
    afStack_d80[0] = INFINITY;
    afStack_d80[1] = INFINITY;
    local_d78 = (undefined1  [8])0xff800000ff800000;
    afStack_d70[0] = -INFINITY;
    afStack_d70[1] = -INFINITY;
    local_d68.lower = 0.0;
    local_d68.upper = 0.0;
    pSStack_d60 = (Split *)0x0;
    local_d58[0].lower = 0.0;
    local_d58[0].upper = 0.0;
    local_d58[1].lower = 0.0;
    local_d58[1].upper = 0.0;
    local_d48[0] = 0.0;
    local_d48[1] = 1.0;
    uStack_d40._0_4_ = 1.0;
    uStack_d40._4_4_ = 0.0;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds0.lower.field_0._0_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds0.lower.field_0._8_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds0.upper.field_0._0_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds0.upper.field_0._8_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds1.lower.field_0._0_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds1.lower.field_0._8_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds1.upper.field_0._0_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds1.upper.field_0._8_8_ = 0x7f8000007f800000;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_8_ = 0xff800000ff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    values[1].lbounds.bounds0.upper.field_0.m128[1] = 1.0;
    values[1].lbounds.bounds0.upper.field_0.m128[2] = 1.0;
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    isLeft.vSplitPos = &vSplitPos;
    lVar66 = (long)(1 << ((byte)csplit.dim & 0x1f)) * 0x10;
    vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar66);
    vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar66 + 8);
    isLeft.vSplitMask = &vSplitMask;
    pBVar92 = context;
    isLeft.split = &csplit;
    local_1628 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                   (((context->prims).prims)->items,(size_t)BVar7,(size_t)BVar6,
                                    (EmptyTy *)&vSplitPos_1,
                                    (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lock,
                                    (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,&isLeft,
                                    &reduction,&reduction2,0x80,0xc00);
    local_15f8 = (BBox1f)(context->prims).prims;
    BVar4 = (context->prims).super_PrimInfoMB.time_range;
    local_15e8._0_8_ = lock.mutex;
    local_15e8._8_8_ = lock._8_8_;
    local_15d8 = local_db8;
    uStack_15d0._0_4_ = afStack_db0[0];
    uStack_15d0._4_4_ = afStack_db0[1];
    local_15c8 = local_da8;
    uStack_15c0._0_4_ = afStack_da0[0];
    uStack_15c0._4_4_ = afStack_da0[1];
    local_15b8 = local_d98;
    uStack_15b0._0_4_ = afStack_d90[0];
    uStack_15b0._4_4_ = afStack_d90[1];
    local_15a8 = local_d88;
    uStack_15a0._0_4_ = afStack_d80[0];
    uStack_15a0._4_4_ = afStack_d80[1];
    local_1598.lower = (float)local_d78._0_4_;
    local_1598.upper = (float)local_d78._4_4_;
    pSStack_1590 = (Split *)afStack_d70;
    local_1578 = local_d58[0];
    BStack_1570 = local_d58[1];
    local_1568.upper = local_d48[1];
    local_1568.lower = local_d48[0];
    fVar78 = BVar4.lower;
    fVar89 = fVar78;
    if (fVar78 <= (float)uStack_d40) {
      fVar89 = (float)uStack_d40;
    }
    fVar79 = BVar4.upper;
    if (fVar79 <= uStack_d40._4_4_) {
      uStack_d40._4_4_ = fVar79;
    }
    uStack_1560 = CONCAT44(uStack_d40._4_4_,fVar89);
    local_1698._16_8_ = values[0].ref.ptr;
    local_1698._24_8_ = values[0]._8_8_;
    local_1678._0_8_ = values[0].lbounds.bounds0.lower.field_0._0_8_;
    local_1678._8_8_ = values[0].lbounds.bounds0.lower.field_0._8_8_;
    local_1668._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
    local_1668._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
    local_1658._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
    local_1658._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
    local_1648._0_8_ = values[0].lbounds.bounds1.upper.field_0._0_8_;
    local_1648._8_8_ = values[0].lbounds.bounds1.upper.field_0._8_8_;
    local_1638 = values[0].dt;
    pSStack_1630 = (Split *)values[0]._88_8_;
    local_1608 = CONCAT44(values[1].lbounds.bounds0.upper.field_0.m128[1],
                          values[1].lbounds.bounds0.upper.field_0.m128[0]);
    local_1618.lower = (float)values[1].lbounds.bounds0.lower.field_0._0_4_;
    local_1618.upper = (float)values[1].lbounds.bounds0.lower.field_0._4_4_;
    BStack_1610.lower = (float)values[1].lbounds.bounds0.lower.field_0._8_4_;
    BStack_1610.upper = (float)values[1].lbounds.bounds0.lower.field_0._12_4_;
    if (fVar78 <= (float)values[1].lbounds.bounds0.upper.field_0._8_4_) {
      BVar4.upper = 0.0;
      BVar4.lower = (float)values[1].lbounds.bounds0.upper.field_0._8_4_;
    }
    uVar16 = values[1].lbounds.bounds0.upper.field_0.m128[3];
    if (fVar79 <= (float)values[1].lbounds.bounds0.upper.field_0._12_4_) {
      uVar16 = fVar79;
    }
    uStack_1600 = CONCAT44(uVar16,BVar4.lower);
    context = pBVar92;
    BStack_1620 = BVar6;
    local_1588 = BVar7;
    BStack_1580 = local_1628;
    local_1558 = local_15f8;
LAB_00d47d4d:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
  }
  else {
    if (csplit.data != 2) {
      if (csplit.data == 1) {
        SetMB::deterministic_order(set);
        splitFallback(this,set,(SetMB *)&local_15e8.field_1,(SetMB *)(local_1698 + 0x10));
      }
      else if (csplit.data == 3) {
        SetMB::deterministic_order(set);
        splitByGeometry(this,set,(SetMB *)&local_15e8.field_1,(SetMB *)(local_1698 + 0x10));
      }
      goto LAB_00d47d4d;
    }
    time_range0.upper = csplit.field_2.fpos;
    time_range1.upper = (context->prims).super_PrimInfoMB.time_range.upper;
    time_range1.lower = csplit.field_2.fpos;
    BVar6 = (BBox1f)(context->prims).prims;
    time_range0.lower = fVar89;
    _Var63.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )operator_new(0x28);
    pMVar9 = (this->heuristicTemporalSplit).device;
    *(MemoryMonitorInterface **)
     _Var63.
     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     .
     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
     ._M_head_impl = pMVar9;
    *(undefined1 *)
     ((long)_Var63.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl + 8) = 0;
    uVar70 = uVar60 * 0x50;
    *(long *)((long)_Var63.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x10) = 0;
    *(long *)((long)_Var63.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x18) = 0;
    *(long *)((long)_Var63.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x20) = 0;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar70,0);
    if (uVar70 < 0x1c00000) {
      pvVar61 = alignedMalloc(uVar70,0x10);
    }
    else {
      pvVar61 = os_malloc(uVar70,(bool *)((long)_Var63.
                                                super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                .
                                                super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                ._M_head_impl + 8));
    }
    local_18c8._0_8_ = &this->heuristicTemporalSplit;
    *(void **)((long)_Var63.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x20) = pvVar61;
    *(ulong *)((long)_Var63.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x10) = uVar60;
    *(ulong *)((long)_Var63.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x18) = uVar60;
    local_18c8._8_8_ = &lprims;
    pSVar13 = (Split *)(context->prims).super_PrimInfoMB.object_range._begin;
    pvVar15 = (vint *)(context->prims).super_PrimInfoMB.object_range._end;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds0.lower.field_0._0_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds0.lower.field_0._8_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds0.upper.field_0._0_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds0.upper.field_0._8_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds1.lower.field_0._0_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds1.lower.field_0._8_8_ = 0xff800000ff800000;
    values[0].lbounds.bounds1.upper.field_0._0_8_ = 0x7f8000007f800000;
    values[0].lbounds.bounds1.upper.field_0._8_8_ = 0x7f8000007f800000;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_8_ = 0xff800000ff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    values[1].lbounds.bounds0.upper.field_0.m128[1] = 1.0;
    values[1].lbounds.bounds0.upper.field_0.m128[2] = 1.0;
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )_Var63.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    lprims = (PrimRefVector)
             _Var63.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    vSplitMask.field_0._0_8_ = BVar6;
    vSplitMask.field_0._8_8_ = &time_range0;
    if ((ulong)((long)pvVar15 - (long)pSVar13) < 0xc00) {
      isLeft.split = pSVar13;
      isLeft.vSplitPos = pvVar15;
      ::anon_func::anon_class_40_5_808acc65::operator()
                ((PrimInfoMB *)&lock,(anon_class_40_5_808acc65 *)&vSplitMask,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
      tbb::detail::r1::initialize((task_group_context *)&isLeft);
      local_1828._0_8_ = (BBox1f *)0x80;
      _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      vSplitPos.field_0.v[0] = (longlong)pvVar15;
      vSplitPos.field_0.v[1] = (longlong)pSVar13;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lock,(d1 *)&vSplitPos,
                 (blocked_range<unsigned_long> *)values,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                 (anon_class_16_2_ed117de8_conflict29 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&isLeft,(task_group_context *)context);
      cVar57 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar57 != '\0') {
        prVar65 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar65,"task cancelled");
        __cxa_throw(prVar65,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&isLeft);
    }
    uVar69 = (context->prims).super_PrimInfoMB.object_range._end -
             (context->prims).super_PrimInfoMB.object_range._begin;
    if ((long)pSStack_d60 - (long)local_d68 != uVar69) {
      values[0].ref.ptr = (size_t)&time_range0;
      pSStack_d60 = (Split *)parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                       (lprims->items,0,uVar69,0x400,
                                        (anon_class_8_1_41ce32a5 *)values);
    }
    local_1578 = local_d58[0];
    BStack_1570 = local_d58[1];
    local_15e8._0_8_ = lock.mutex;
    local_15e8._8_8_ = lock._8_8_;
    local_15d8 = local_db8;
    uStack_15d0._0_4_ = afStack_db0[0];
    uStack_15d0._4_4_ = afStack_db0[1];
    local_15c8 = local_da8;
    uStack_15c0._0_4_ = afStack_da0[0];
    uStack_15c0._4_4_ = afStack_da0[1];
    local_15b8 = local_d98;
    uStack_15b0._0_4_ = afStack_d90[0];
    uStack_15b0._4_4_ = afStack_d90[1];
    local_15a8 = local_d88;
    uStack_15a0._0_4_ = afStack_d80[0];
    uStack_15a0._4_4_ = afStack_d80[1];
    local_1598.lower = (float)local_d78._0_4_;
    local_1598.upper = (float)local_d78._4_4_;
    pSStack_1590 = (Split *)afStack_d70;
    local_1588 = local_d68;
    BStack_1580 = (BBox1f)pSStack_d60;
    local_1568.upper = local_d48[1];
    local_1568.lower = local_d48[0];
    uStack_1560 = CONCAT44(~-(uint)(uStack_d40._4_4_ < time_range0.upper) & (uint)time_range0.upper,
                           ~-(uint)((float)uStack_d40 < time_range0.lower) & (uint)(float)uStack_d40
                          ) |
                  CONCAT44((uint)uStack_d40._4_4_ & -(uint)(uStack_d40._4_4_ < time_range0.upper),
                           (uint)time_range0.lower & -(uint)((float)uStack_d40 < time_range0.lower))
    ;
    local_1558 = (BBox1f)lprims;
    uVar69 = (context->prims).super_PrimInfoMB.object_range._begin;
    pBVar68 = (BBox1f *)(context->prims).super_PrimInfoMB.object_range._end;
    isLeft.split = (Split *)0x7f8000007f800000;
    isLeft.vSplitPos = (vint *)0x7f8000007f800000;
    isLeft.vSplitMask = (vbool *)0xff800000ff800000;
    uStack_1a50 = 0xff800000ff800000;
    local_1a48._0_8_ = (Lock<embree::MutexSys> *)0x7f8000007f800000;
    local_1a48._8_8_ = (PrimRefVector *)0x7f8000007f800000;
    local_1a38._0_8_ = (SetMB *)0xff800000ff800000;
    local_1a38._8_8_ = 0xff800000ff800000;
    local_1a28._0_8_ = 0x7f8000007f800000;
    local_1a28._8_8_ = 0x7f8000007f800000;
    local_1a18.lower = -INFINITY;
    local_1a18.upper = -INFINITY;
    acStack_1a10[0] = '\0';
    acStack_1a10[1] = '\0';
    acStack_1a10[2] = -0x80;
    acStack_1a10[3] = -1;
    acStack_1a10[4] = '\0';
    acStack_1a10[5] = '\0';
    acStack_1a10[6] = -0x80;
    acStack_1a10[7] = -1;
    local_1a08.lower = 0.0;
    local_1a08.upper = 0.0;
    pSStack_1a00 = (Split *)0x0;
    local_19f8.lower = 0.0;
    local_19f8.upper = 0.0;
    BStack_19f0.lower = 0.0;
    BStack_19f0.upper = 0.0;
    local_19e8 = 0;
    uStack_19e4 = 0x3f800000;
    uStack_19e0 = 0x3f800000;
    uStack_19dc = 0;
    _reduction2 = BVar6;
    if ((long)pBVar68 - uVar69 < 0xc00) {
      vSplitPos.field_0.v[0] = uVar69;
      vSplitPos.field_0.v[1] = (longlong)pBVar68;
      ::anon_func::anon_class_24_3_35f68c7c::operator()
                ((PrimInfoMB *)values,(anon_class_24_3_35f68c7c *)&reduction2,
                 (range<unsigned_long> *)&vSplitPos);
    }
    else {
      vSplitPos.field_0.v[1]._4_2_ = 0x401;
      local_1818 = (intrusive_list_node *)0x0;
      piStack_1810 = (intrusive_list_node *)0x0;
      local_17f8 = CUSTOM_CTX;
      tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
      vSplitPos_1.field_0.v[0] = (longlong)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      vSplitPos_1.field_0.v[1] = (longlong)&reduction2;
      _reduction = (code *)pBVar68;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&isLeft,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitPos_1,
                 (anon_class_16_2_ed117de8_conflict30 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&vSplitPos,(task_group_context *)context);
      cVar57 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
      if (cVar57 != '\0') {
        prVar65 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar65,"task cancelled");
        __cxa_throw(prVar65,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
    }
    lVar66 = values[1]._8_8_ - values[1].ref.ptr;
    values[1].ref.ptr = (context->prims).super_PrimInfoMB.object_range._begin;
    values[1]._8_8_ = lVar66 + values[1].ref.ptr;
    uVar69 = (context->prims).super_PrimInfoMB.object_range._end;
    if (lVar66 != uVar69 - values[1].ref.ptr) {
      isLeft.split = (Split *)&time_range1;
      values[1]._8_8_ =
           parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                     ((PrimRefMB *)
                      ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar6 + 0x20))->reduction,
                      values[1].ref.ptr,uVar69,0x400,(anon_class_8_1_41ce32a6 *)&isLeft);
    }
    local_1698._16_8_ = values[0].ref.ptr;
    local_1698._24_8_ = values[0]._8_8_;
    local_1678._0_8_ = values[0].lbounds.bounds0.lower.field_0._0_8_;
    local_1678._8_8_ = values[0].lbounds.bounds0.lower.field_0._8_8_;
    local_1668._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
    local_1668._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
    local_1658._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
    local_1658._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
    local_1648.m128[0] = (float)values[0].lbounds.bounds1.upper.field_0._0_4_;
    local_1648.m128[1] = (float)values[0].lbounds.bounds1.upper.field_0._4_4_;
    local_1648._8_8_ = values[0].lbounds.bounds1.upper.field_0._8_8_;
    local_1638 = values[0].dt;
    pSStack_1630 = (Split *)values[0]._88_8_;
    local_1618.lower = (float)values[1].lbounds.bounds0.lower.field_0._0_4_;
    local_1618.upper = (float)values[1].lbounds.bounds0.lower.field_0._4_4_;
    BStack_1610.lower = (float)values[1].lbounds.bounds0.lower.field_0._8_4_;
    BStack_1610.upper = (float)values[1].lbounds.bounds0.lower.field_0._12_4_;
    local_1628.lower = (float)(undefined4)values[1].ref.ptr;
    local_1628.upper = (float)values[1].ref.ptr._4_4_;
    BStack_1620.lower = (float)values[1]._8_4_;
    BStack_1620.upper = (float)values[1]._12_4_;
    local_1608 = CONCAT44(values[1].lbounds.bounds0.upper.field_0.m128[1],
                          values[1].lbounds.bounds0.upper.field_0.m128[0]);
    uVar75 = -(uint)((float)values[1].lbounds.bounds0.upper.field_0._8_4_ < time_range1.lower);
    uVar76 = -(uint)((float)values[1].lbounds.bounds0.upper.field_0._12_4_ < time_range1.upper);
    uStack_1600 = CONCAT44(~uVar76 & (uint)time_range1.upper,
                           ~uVar75 & values[1].lbounds.bounds0.upper.field_0.m128[2]) |
                  CONCAT44(values[1].lbounds.bounds0.upper.field_0.m128[3] & uVar76,
                           (uint)time_range1.lower & uVar75);
    local_18b8._0_8_ = set;
    local_15f8 = BVar6;
  }
  BVar56 = local_1558;
  uVar60 = uStack_1560;
  BVar55 = local_1568;
  BVar54 = BStack_1580;
  BVar53 = local_1588;
  pSVar14 = pSStack_1590;
  BVar52 = local_1598;
  uVar50 = uStack_15a0;
  uVar49 = local_15a8;
  uVar47 = uStack_15b0;
  uVar46 = local_15b8;
  uVar44 = uStack_15c0;
  uVar43 = local_15c8;
  uVar41 = uStack_15d0;
  uVar40 = local_15d8;
  uVar38 = local_15e8._8_8_;
  uVar21 = local_15e8._0_8_;
  BVar37 = local_15f8;
  BVar36 = BStack_1620;
  BVar4 = local_1628;
  pSVar13 = pSStack_1630;
  BVar7 = local_1638;
  uVar71 = local_1668._0_8_;
  bVar74 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )new_vector._M_t.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl !=
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
  local_248 = 1;
  local_40 = 1;
  pMVar59 = (MutexSys *)context->depth;
  local_db8 = *(undefined1 (*) [8])
               &(context->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.lower.field_0;
  afStack_db0 = *(float (*) [2])
                 ((long)&(context->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                         field_0 + 8);
  local_da8 = *(undefined1 (*) [8])
               &(context->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.upper.field_0;
  afStack_da0 = *(float (*) [2])
                 ((long)&(context->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                         field_0 + 8);
  local_d98 = *(undefined1 (*) [8])
               &(context->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.lower.field_0;
  afStack_d90 = *(float (*) [2])
                 ((long)&(context->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                         field_0 + 8);
  local_d88 = *(undefined1 (*) [8])
               &(context->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.upper.field_0;
  afStack_d80 = *(float (*) [2])
                 ((long)&(context->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                         field_0 + 8);
  local_d78 = *(undefined1 (*) [8])
               &(context->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                centBounds.lower.field_0;
  afStack_d70 = *(float (*) [2])
                 ((long)&(context->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0 + 8
                 );
  local_d68 = *(BBox1f *)
               &(context->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                centBounds.upper.field_0;
  pSStack_d60 = *(Split **)
                 ((long)&(context->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0 + 8
                 );
  local_d58[0] = (BBox1f)(context->prims).super_PrimInfoMB.object_range._begin;
  local_d58[1] = (BBox1f)(context->prims).super_PrimInfoMB.object_range._end;
  sVar64 = (context->prims).super_PrimInfoMB.num_time_segments;
  sVar17 = (context->prims).super_PrimInfoMB.max_num_time_segments;
  local_d48[0] = (float)sVar64;
  local_d48[1] = (float)(sVar64 >> 0x20);
  uStack_d40._0_4_ = (float)sVar17;
  uStack_d40._4_4_ = (float)(sVar17 >> 0x20);
  local_d38 = (context->prims).super_PrimInfoMB.max_time_range;
  BStack_d30 = (context->prims).super_PrimInfoMB.time_range;
  BVar6 = (BBox1f)(context->prims).prims;
  local_240 = BVar6;
  local_238 = 2;
  isLeft.split = (Split *)local_1578;
  isLeft.vSplitPos = (vint *)BStack_1570;
  uVar16 = local_1698._16_4_;
  uVar22 = local_1698._20_4_;
  uVar23 = local_1698._24_4_;
  uVar24 = local_1698._28_4_;
  uVar25 = local_1678.m128[0];
  uVar26 = local_1678.m128[1];
  uVar27 = local_1678.m128[2];
  uVar28 = local_1678.m128[3];
  uVar29 = local_1668.m128[1];
  uVar30 = local_1668.m128[2];
  uVar31 = local_1668.m128[3];
  uVar32 = local_1658.m128[0];
  uVar33 = local_1658.m128[1];
  uVar34 = local_1658.m128[2];
  uVar35 = local_1658.m128[3];
  vSplitPos.field_0._0_4_ = local_1618.lower;
  vSplitPos.field_0._4_4_ = local_1618.upper;
  vSplitPos.field_0._8_4_ = BStack_1610.lower;
  vSplitPos.field_0._12_4_ = BStack_1610.upper;
  fVar89 = (float)local_1608;
  fVar78 = local_1608._4_4_;
  fVar79 = (float)uStack_1600;
  fVar80 = uStack_1600._4_4_;
  new_vector._M_t.
  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  if (local_1558 == BVar6) {
    local_2c8[0] = &local_240;
    local_238 = 3;
  }
  else {
    local_40 = 2;
    local_230 = local_1558;
    local_228 = 1;
    local_2c8[0] = &local_230;
  }
  lVar66 = local_40;
  if (local_15f8 == BVar6) {
    local_2c8[1] = &local_240;
    local_238 = local_238 + 1;
  }
  else {
    local_40 = local_40 + 1;
    (&local_240)[lVar66 * 2] = local_15f8;
    (&local_238)[lVar66 * 2] = 1;
    local_2c8[1] = &local_240 + lVar66 * 2;
  }
  local_238 = local_238 + -1;
  uVar82 = local_1648.m128[0];
  uVar83 = local_1648.m128[1];
  uVar84 = local_1648.m128[2];
  uVar85 = local_1648.m128[3];
  if ((local_238 == 0) && (BVar6 != (BBox1f)0x0)) {
    local_1980.m128[2] = local_1648.m128[0];
    local_1980.m128[3] = local_1648.m128[1];
    auStack_1970._0_4_ = local_1648.m128[2];
    auStack_1970._4_4_ = local_1648.m128[3];
    paVar8 = *(anon_class_16_2_aeee9775_conflict **)((long)BVar6 + 0x18);
    ptr = ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar6 + 0x20))->reduction;
    lock.mutex = pMVar59;
    local_d28[0] = BVar6;
    if (ptr != (anon_class_1_0_00000001 *)0x0) {
      if ((ulong)((long)paVar8 * 0x50) < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,(long)paVar8 * 0x50,*(bool *)((long)BVar6 + 8));
      }
    }
    if (paVar8 != (anon_class_16_2_aeee9775_conflict *)0x0) {
      (**(code **)**(undefined8 **)BVar6)(*(undefined8 **)BVar6,(long)paVar8 * -0x50,1);
    }
    ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar6 + 0x10))->reduction =
         (anon_class_1_0_00000001 *)0x0;
    *(anon_class_16_2_aeee9775_conflict **)((long)BVar6 + 0x18) =
         (anon_class_16_2_aeee9775_conflict *)0x0;
    ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar6 + 0x20))->reduction =
         (anon_class_1_0_00000001 *)0x0;
    operator_delete((void *)BVar6);
    uVar82 = local_1980.m128[2];
    uVar83 = local_1980.m128[3];
    uVar84 = auStack_1970._0_4_;
    uVar85 = auStack_1970._4_4_;
  }
  uVar70 = local_248;
  uVar51 = uStack_15a0;
  uVar48 = uStack_15b0;
  uVar45 = uStack_15c0;
  uVar42 = uStack_15d0;
  uVar39 = local_15e8._8_8_;
  lock.mutex = (MutexSys *)((long)&pMVar59->mutex + 1);
  local_db8 = (undefined1  [8])uVar21;
  local_15e8.m128[2] = (float)(int)uVar38;
  local_15e8.m128[3] = (float)SUB84(uVar38,4);
  afStack_db0[0] = local_15e8.m128[2];
  afStack_db0[1] = local_15e8.m128[3];
  local_da8 = (undefined1  [8])uVar40;
  uStack_15d0._0_4_ = (undefined4)uVar41;
  uStack_15d0._4_4_ = SUB84(uVar41,4);
  afStack_da0[0] = (float)(undefined4)uStack_15d0;
  afStack_da0[1] = (float)uStack_15d0._4_4_;
  local_d98 = (undefined1  [8])uVar43;
  uStack_15c0._0_4_ = (undefined4)uVar44;
  uStack_15c0._4_4_ = SUB84(uVar44,4);
  afStack_d90[0] = (float)(undefined4)uStack_15c0;
  afStack_d90[1] = (float)uStack_15c0._4_4_;
  local_d88 = (undefined1  [8])uVar46;
  uStack_15b0._0_4_ = (undefined4)uVar47;
  uStack_15b0._4_4_ = SUB84(uVar47,4);
  afStack_d80[0] = (float)(undefined4)uStack_15b0;
  afStack_d80[1] = (float)uStack_15b0._4_4_;
  local_d78 = (undefined1  [8])uVar49;
  uStack_15a0._0_4_ = (undefined4)uVar50;
  uStack_15a0._4_4_ = SUB84(uVar50,4);
  afStack_d70[0] = (float)(undefined4)uStack_15a0;
  afStack_d70[1] = (float)uStack_15a0._4_4_;
  local_d68 = BVar52;
  pSStack_d60 = pSVar14;
  local_d58[0] = BVar53;
  local_d58[1] = BVar54;
  local_d48[0] = SUB84(isLeft.split,0);
  local_d48[1] = (float)((ulong)isLeft.split >> 0x20);
  uStack_d40._0_4_ = SUB84(isLeft.vSplitPos,0);
  uStack_d40._4_4_ = (float)((ulong)isLeft.vSplitPos >> 0x20);
  local_d38 = BVar55;
  BStack_d30 = (BBox1f)uVar60;
  local_d28[0] = BVar56;
  lVar66 = local_248 * 0xb0;
  (&lock)[local_248 * 0xb].mutex = lock.mutex;
  *(undefined4 *)(local_db8 + uVar70 * 0xb0) = uVar16;
  *(undefined4 *)(local_db8 + lVar66 + 4) = uVar22;
  afStack_db0[uVar70 * 0x2c] = (float)uVar23;
  afStack_db0[uVar70 * 0x2c + 1] = (float)uVar24;
  *(undefined4 *)(local_da8 + uVar70 * 0xb0) = uVar25;
  *(undefined4 *)(local_da8 + lVar66 + 4) = uVar26;
  afStack_da0[uVar70 * 0x2c] = (float)uVar27;
  afStack_da0[uVar70 * 0x2c + 1] = (float)uVar28;
  *(int *)(local_d98 + uVar70 * 0xb0) = (int)uVar71;
  *(undefined4 *)(local_d98 + lVar66 + 4) = uVar29;
  afStack_d90[uVar70 * 0x2c] = (float)uVar30;
  afStack_d90[uVar70 * 0x2c + 1] = (float)uVar31;
  *(undefined4 *)(local_d88 + uVar70 * 0xb0) = uVar32;
  *(undefined4 *)(local_d88 + lVar66 + 4) = uVar33;
  afStack_d80[uVar70 * 0x2c] = (float)uVar34;
  afStack_d80[uVar70 * 0x2c + 1] = (float)uVar35;
  *(undefined4 *)(local_d78 + uVar70 * 0xb0) = uVar82;
  *(undefined4 *)(local_d78 + lVar66 + 4) = uVar83;
  afStack_d70[uVar70 * 0x2c] = (float)uVar84;
  afStack_d70[uVar70 * 0x2c + 1] = (float)uVar85;
  (&local_d68)[uVar70 * 0x16] = BVar7;
  (&pSStack_d60)[uVar70 * 0x16] = pSVar13;
  local_d58[uVar70 * 0x16] = BVar4;
  local_d58[uVar70 * 0x16 + 1] = BVar36;
  *(longlong *)(local_d48 + uVar70 * 0x2c) = vSplitPos.field_0.v[0];
  (&uStack_d40)[uVar70 * 0x16] = vSplitPos.field_0.v[1];
  (&local_d38)[uVar70 * 0x16].lower = fVar89;
  (&local_d38)[uVar70 * 0x16].upper = fVar78;
  local_d28[uVar70 * 0x16 + -1].lower = fVar79;
  local_d28[uVar70 * 0x16 + -1].upper = fVar80;
  local_d28[uVar70 * 0x16] = BVar37;
  local_248 = local_248 + 1;
  local_1a88._8_8_ = 0x7f8000007f800000;
  local_1a88._0_8_ = 0x7f8000007f800000;
  local_1a98._8_4_ = 0xff800000;
  local_1a98._0_8_ = 0xff800000ff800000;
  local_1a98._12_4_ = 0xff800000;
  local_15e8._8_8_ = uVar39;
  uStack_15d0 = uVar42;
  uStack_15c0 = uVar45;
  uStack_15b0 = uVar48;
  uStack_15a0 = uVar51;
  do {
    if ((this->cfg).branchingFactor <= local_248) break;
    if (local_248 == 0) {
      uVar60 = 0xffffffffffffffff;
    }
    else {
      uVar60 = 0xffffffffffffffff;
      pBVar68 = local_d58 + 1;
      fVar89 = -INFINITY;
      uVar70 = 0;
      do {
        if (((this->cfg).minLeafSize < (ulong)((long)*pBVar68 - (long)pBVar68[-1])) &&
           (fVar80 = pBVar68[-0xb].upper - pBVar68[-0xd].upper,
           fVar81 = pBVar68[-10].lower - pBVar68[-0xc].lower,
           fVar78 = pBVar68[-7].upper - pBVar68[-9].upper,
           fVar79 = pBVar68[-6].lower - pBVar68[-8].lower,
           fVar78 = ((pBVar68[-7].lower - pBVar68[-9].lower) * (fVar78 + fVar79) + fVar79 * fVar78 +
                    (pBVar68[-0xb].lower - pBVar68[-0xd].lower) * (fVar80 + fVar81) +
                    fVar81 * fVar80) * 0.5, fVar89 < fVar78)) {
          uVar60 = uVar70;
          fVar89 = fVar78;
        }
        uVar70 = uVar70 + 1;
        pBVar68 = pBVar68 + 0x16;
      } while (local_248 != uVar70);
    }
    if (uVar60 != 0xffffffffffffffff) {
      isLeft.split = (Split *)(context->depth + 1);
      set_00 = (SetMB *)(local_db8 + uVar60 * 0xb0);
      vSplitPos.field_0.v[0] = (longlong)isLeft.split;
      find((Split *)&time_range0,this,set_00);
      if (fStack_14bc == 0.0) {
        local_19f8 = local_d58[uVar60 * 0x16];
        BVar7 = local_d58[uVar60 * 0x16 + 1];
        vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
        vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
        local_18c8._0_8_ = (Lock<embree::MutexSys> *)0xff800000ff800000;
        local_18c8._8_8_ = (PrimRefVector *)0xff800000ff800000;
        local_18b8._0_8_ = (SetMB *)0x7f8000007f800000;
        local_18b8._8_8_ = 0x7f8000007f800000;
        local_18a8._0_8_ = 0xff800000ff800000;
        local_18a8._8_8_ = 0xff800000ff800000;
        local_1898._0_8_ = 0x7f8000007f800000;
        local_1898._8_8_ = 0x7f8000007f800000;
        local_1888.m128[0] = -INFINITY;
        local_1888.m128[1] = -INFINITY;
        local_1888._8_8_ = (Split *)0xff800000ff800000;
        local_1858 = 0.0;
        local_1878.lower = 0.0;
        local_1878.upper = 0.0;
        BStack_1870.lower = 0.0;
        BStack_1870.upper = 0.0;
        fStack_1854 = 1.0;
        fStack_1850 = 1.0;
        fStack_184c = 0.0;
        _reduction = (code *)0x7f8000007f800000;
        vSplitPos_1.field_0.i[1] = local_14c0.pos;
        vSplitPos_1.field_0.i[0] = (int)local_14c0;
        vSplitPos_1.field_0._12_4_ = local_14c0.pos;
        vSplitPos_1.field_0._8_4_ = local_14c0;
        time_range1 = *(BBox1f *)
                       (mm_lookupmask_ps + (long)(1 << (time_range0.upper._0_1_ & 0x1f)) * 0x10);
        _reduction2 = &time_range0;
        BStack_19f0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_d28[uVar60 * 0x16] + 0x20),
                                         (size_t)local_19f8,(size_t)BVar7,(EmptyTy *)local_1698,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                                         (anon_class_24_3_c5d13451 *)&reduction2,
                                         (anon_class_1_0_00000001 *)&lprims,&reduction2_1,0x80,0xc00
                                        );
        local_19c8 = local_d28[uVar60 * 0x16];
        BVar6 = local_d28[uVar60 * 0x16 + -1];
        isLeft.vSplitMask = (vbool *)vSplitMask.field_0._0_8_;
        uStack_1a50 = vSplitMask.field_0._8_8_;
        local_1a48._0_8_ = (Lock<embree::MutexSys> *)0xff800000ff800000;
        local_1a48._8_8_ = (PrimRefVector *)0xff800000ff800000;
        local_1a38._0_8_ = (SetMB *)0x7f8000007f800000;
        local_1a38._8_8_ = 0x7f8000007f800000;
        local_1a28._0_8_ = 0xff800000ff800000;
        local_1a28._8_8_ = 0xff800000ff800000;
        local_1a18.lower = INFINITY;
        local_1a18.upper = INFINITY;
        acStack_1a10[0] = '\0';
        acStack_1a10[1] = '\0';
        acStack_1a10[2] = -0x80;
        acStack_1a10[3] = '\x7f';
        acStack_1a10[4] = '\0';
        acStack_1a10[5] = '\0';
        acStack_1a10[6] = -0x80;
        acStack_1a10[7] = '\x7f';
        local_1a08.lower = -INFINITY;
        local_1a08.upper = -INFINITY;
        pSStack_1a00 = (Split *)0xff800000ff800000;
        fVar78 = BVar6.lower;
        fVar89 = fVar78;
        if (fVar78 <= BStack_19d0.lower) {
          fVar89 = BStack_19d0.lower;
        }
        fVar79 = BVar6.upper;
        if (fVar79 <= BStack_19d0.upper) {
          BStack_19d0.upper = fVar79;
        }
        BStack_19d0.lower = fVar89;
        local_1828._0_8_ = _reduction;
        local_1828._8_8_ = 0x7f8000007f800000;
        local_1818 = (intrusive_list_node *)0xff800000ff800000;
        piStack_1810 = (intrusive_list_node *)0xff800000ff800000;
        local_1808._M_b._M_p = (__base_type)(__pointer_type)0x7f8000007f800000;
        pvStack_1800 = (void *)0x7f8000007f800000;
        local_17f8 = 0xff800000ff800000;
        acStack_17f0[0] = '\0';
        acStack_17f0[1] = '\0';
        acStack_17f0[2] = -0x80;
        acStack_17f0[3] = -1;
        acStack_17f0[4] = '\0';
        acStack_17f0[5] = '\0';
        acStack_17f0[6] = -0x80;
        acStack_17f0[7] = -1;
        acStack_17f0[8] = '\0';
        acStack_17f0[9] = '\0';
        acStack_17f0[10] = -0x80;
        acStack_17f0[0xb] = '\x7f';
        acStack_17f0[0xc] = '\0';
        acStack_17f0[0xd] = '\0';
        acStack_17f0[0xe] = -0x80;
        acStack_17f0[0xf] = '\x7f';
        acStack_17f0[0x10] = '\0';
        acStack_17f0[0x11] = '\0';
        acStack_17f0[0x12] = -0x80;
        acStack_17f0[0x13] = '\x7f';
        acStack_17f0[0x14] = '\0';
        acStack_17f0[0x15] = '\0';
        acStack_17f0[0x16] = -0x80;
        acStack_17f0[0x17] = '\x7f';
        local_17d8.lower = -INFINITY;
        local_17d8.upper = -INFINITY;
        pSStack_17d0 = (Split *)0xff800000ff800000;
        local_17a8._0_4_ = 0.0;
        fStack_179c = 0.0;
        fStack_17b4 = 0.0;
        local_17b8 = 0.0;
        uStack_17ac = 0;
        uStack_17b0 = 0;
        if (fVar78 <= 1.0) {
          BVar6.lower = 1.0;
          BVar6.upper = 0.0;
        }
        if (fVar79 <= 0.0) {
          fStack_179c = fVar79;
        }
        fStack_17a0 = BVar6.lower;
        local_17c8 = BStack_19f0;
        BStack_17c0 = BVar7;
        local_1798 = local_19c8;
LAB_00d48659:
        new_vector_1._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        if (fStack_14bc != 2.8026e-45) {
          if (fStack_14bc == 1.4013e-45) {
            SetMB::deterministic_order(set_00);
            splitFallback(this,set_00,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1828.field_1);
          }
          else if (fStack_14bc == 4.2039e-45) {
            SetMB::deterministic_order(set_00);
            splitByGeometry(this,set_00,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1828.field_1);
          }
          goto LAB_00d48659;
        }
        time_range0_1.lower = local_d28[uVar60 * 0x16 + -1].lower;
        time_range0_1.upper = local_14c0.fpos;
        time_range1_1.lower = local_14c0.fpos;
        time_range1_1.upper = local_d28[uVar60 * 0x16 + -1].upper;
        local_1980._8_8_ = local_d28[uVar60 * 0x16];
        local_19c8 = (BBox1f)operator_new(0x28);
        pMVar9 = (this->heuristicTemporalSplit).device;
        BVar6 = local_d58[uVar60 * 0x16 + 1];
        *(MemoryMonitorInterface **)local_19c8 = pMVar9;
        *(undefined1 *)((long)local_19c8 + 8) = 0;
        *(long *)((long)local_19c8 + 0x10) = 0;
        *(long *)((long)local_19c8 + 0x18) = 0;
        *(long *)((long)local_19c8 + 0x20) = 0;
        lVar66 = (long)BVar6 - (long)local_d58[uVar60 * 0x16];
        if (lVar66 != 0) {
          uVar70 = lVar66 * 0x50;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar70,0);
          if (uVar70 < 0x1c00000) {
            pvVar61 = alignedMalloc(uVar70,0x10);
          }
          else {
            pvVar61 = os_malloc(uVar70,(bool *)((long)local_19c8 + 8));
          }
          *(void **)((long)local_19c8 + 0x20) = pvVar61;
          *(long *)((long)local_19c8 + 0x10) = lVar66;
          *(long *)((long)local_19c8 + 0x18) = lVar66;
        }
        time_range1.lower = local_1980.m128[2];
        time_range1.upper = local_1980.m128[3];
        BVar6 = local_d58[uVar60 * 0x16];
        BVar7 = local_d58[uVar60 * 0x16 + 1];
        _reduction = (code *)0x7f8000007f800000;
        new_vector_1._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )local_19c8;
        if ((ulong)((long)BVar7 - (long)BVar6) < 0xc00) {
          _reduction2 = BVar6;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)&vSplitMask,(anon_class_40_5_808acc65 *)&time_range1,
                     (range<unsigned_long> *)&reduction2);
        }
        else {
          tbb::detail::r1::initialize((task_group_context *)&reduction2);
          lprims = (PrimRefVector)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1988 = &time_range1;
          vSplitPos_1.field_0.v[0] = (longlong)BVar7;
          vSplitPos_1.field_0.v[1] = (longlong)BVar6;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,(d1 *)&vSplitPos_1,
                     (blocked_range<unsigned_long> *)&reduction,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lprims,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&reduction2,(task_group_context *)context);
          cVar57 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&reduction2);
          if (cVar57 != '\0') {
            prVar65 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar65,"task cancelled");
            __cxa_throw(prVar65,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&reduction2);
        }
        uVar71 = local_1980._8_8_;
        if ((long)BStack_1870 - (long)local_1878 !=
            (long)local_d58[uVar60 * 0x16 + 1] - (long)local_d58[uVar60 * 0x16]) {
          _reduction = (code *)&time_range0_1;
          BStack_1870 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                          (*(PrimRefMB **)((long)local_19c8 + 0x20),0,
                                           (long)local_d58[uVar60 * 0x16 + 1] -
                                           (long)local_d58[uVar60 * 0x16],0x400,
                                           (anon_class_8_1_41ce32a5 *)&reduction);
        }
        uVar38 = vSplitPos_1.field_0.v[1];
        uVar21 = local_1980._8_8_;
        isLeft.vSplitMask = (vbool *)vSplitMask.field_0._0_8_;
        uStack_1a50 = vSplitMask.field_0._8_8_;
        local_1a48._0_8_ = local_18c8._0_8_;
        local_1a48._8_8_ = local_18c8._8_8_;
        local_1a38._0_8_ = local_18b8._0_8_;
        local_1a38._8_8_ = local_18b8._8_8_;
        local_1a28._0_8_ = local_18a8._0_8_;
        local_1a28._8_8_ = local_18a8._8_8_;
        local_1a18.lower = local_1898.m128[0];
        local_1a18.upper = local_1898.m128[1];
        acStack_1a10[0] = local_1898._8_1_;
        acStack_1a10[1] = local_1898._9_1_;
        acStack_1a10[2] = local_1898._10_1_;
        acStack_1a10[3] = local_1898._11_1_;
        acStack_1a10[4] = local_1898._12_1_;
        acStack_1a10[5] = local_1898._13_1_;
        acStack_1a10[6] = local_1898._14_1_;
        acStack_1a10[7] = local_1898._15_1_;
        local_1a08.lower = local_1888.m128[0];
        local_1a08.upper = local_1888.m128[1];
        pSStack_1a00 = (Split *)local_1888._8_8_;
        local_19f8 = local_1878;
        BStack_19f0 = BStack_1870;
        local_19d8.upper = fStack_1854;
        local_19d8.lower = local_1858;
        BStack_19d0 = (BBox1f)(CONCAT44(~-(uint)(fStack_184c < time_range0_1.upper) &
                                        (uint)time_range0_1.upper,
                                        ~-(uint)(fStack_1850 < time_range0_1.lower) &
                                        (uint)fStack_1850) |
                              CONCAT44((uint)fStack_184c &
                                       -(uint)(fStack_184c < time_range0_1.upper),
                                       (uint)time_range0_1.lower &
                                       -(uint)(fStack_1850 < time_range0_1.lower)));
        local_1980.m128[2] = (float)(int)uVar71;
        local_1980.m128[3] = (float)SUB84(uVar71,4);
        _reduction2_1 = local_1980.m128[2];
        fStack_16ac = local_1980.m128[3];
        BVar6 = local_d58[uVar60 * 0x16];
        BVar7 = local_d58[uVar60 * 0x16 + 1];
        _reduction2 = INFINITY;
        uStack_1744 = INFINITY;
        local_1980._8_8_ = uVar21;
        if ((ulong)((long)BVar7 - (long)BVar6) < 0xc00) {
          vSplitPos_1.field_0.v[0] = (longlong)BVar6;
          vSplitPos_1.field_0.v[1] = (longlong)BVar7;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    ((PrimInfoMB *)&reduction,(anon_class_24_3_35f68c7c *)&reduction2_1,
                     (range<unsigned_long> *)&vSplitPos_1);
        }
        else {
          vSplitPos_1.field_0.v[1]._4_1_ = 1;
          vSplitPos_1.field_0.v[1]._6_2_ = SUB82(uVar38,6);
          vSplitPos_1.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos_1);
          local_1980._0_8_ = 0x80;
          local_1698._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1698._8_8_ = &reduction2_1;
          lprims = (PrimRefVector)BVar7;
          local_1988 = BVar6;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,(d1 *)&lprims,
                     (blocked_range<unsigned_long> *)&reduction2,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1698,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos_1,(task_group_context *)context);
          cVar57 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos_1)
          ;
          if (cVar57 != '\0') {
            prVar65 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar65,"task cancelled");
            __cxa_throw(prVar65,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos_1);
          uVar71 = local_1980._8_8_;
        }
        BVar6 = local_d58[uVar60 * 0x16];
        BStack_1900 = BVar6;
        if (local_d58[uVar60 * 0x16 + 1] != BVar6) {
          _reduction2 = &time_range1_1;
          BStack_1900 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                                          (*(PrimRefMB **)(uVar71 + 0x20),(unsigned_long)BVar6,
                                           (unsigned_long)local_d58[uVar60 * 0x16 + 1],0x400,
                                           (anon_class_8_1_41ce32a6 *)&reduction2);
        }
        local_1828._0_8_ = _reduction;
        local_1828._8_8_ = 0x7f8000007f800000;
        local_1818 = (intrusive_list_node *)0xff800000ff800000;
        piStack_1810 = (intrusive_list_node *)0xff800000ff800000;
        local_1808._M_b._M_p = (__base_type)(__pointer_type)0x7f8000007f800000;
        pvStack_1800 = (void *)0x7f8000007f800000;
        local_17f8 = 0xff800000ff800000;
        acStack_17f0[0] = '\0';
        acStack_17f0[1] = '\0';
        acStack_17f0[2] = -0x80;
        acStack_17f0[3] = -1;
        acStack_17f0[4] = '\0';
        acStack_17f0[5] = '\0';
        acStack_17f0[6] = -0x80;
        acStack_17f0[7] = -1;
        acStack_17f0[8] = '\0';
        acStack_17f0[9] = '\0';
        acStack_17f0[10] = -0x80;
        acStack_17f0[0xb] = '\x7f';
        acStack_17f0[0xc] = '\0';
        acStack_17f0[0xd] = '\0';
        acStack_17f0[0xe] = -0x80;
        acStack_17f0[0xf] = '\x7f';
        acStack_17f0[0x10] = '\0';
        acStack_17f0[0x11] = '\0';
        acStack_17f0[0x12] = -0x80;
        acStack_17f0[0x13] = '\x7f';
        acStack_17f0[0x14] = '\0';
        acStack_17f0[0x15] = '\0';
        acStack_17f0[0x16] = -0x80;
        acStack_17f0[0x17] = '\x7f';
        local_17d8.lower = -INFINITY;
        local_17d8.upper = -INFINITY;
        pSStack_17d0 = (Split *)0xff800000ff800000;
        fStack_17b4 = 0.0;
        local_17b8 = 0.0;
        uStack_17ac = 0;
        uStack_17b0 = 0;
        BStack_17c0 = BStack_1900;
        local_17a8 = 0x3f80000000000000;
        fStack_179c = (float)(~-(uint)(0.0 < time_range1_1.upper) & (uint)time_range1_1.upper);
        fStack_17a0 = (float)(~-(uint)(1.0 < time_range1_1.lower) & 0x3f800000 |
                             (uint)time_range1_1.lower & -(uint)(1.0 < time_range1_1.lower));
        local_17c8 = BVar6;
        local_1798 = (BBox1f)uVar71;
      }
      lVar66 = local_40;
      uVar20._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           new_vector_1._M_t.
           super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           .
           super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
           ._M_head_impl;
      new_vector_1._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar68 = local_2c8[uVar60];
      if (local_19c8 == *pBVar68) {
        pBVar68[1] = (BBox1f)((long)pBVar68[1] + 1);
      }
      else {
        local_40 = local_40 + 1;
        (&local_240)[lVar66 * 2] = local_19c8;
        (&local_238)[lVar66 * 2] = 1;
        local_2c8[uVar60] = &local_240 + lVar66 * 2;
      }
      lVar66 = local_40;
      if (local_1798 == *pBVar68) {
        local_2c8[local_248] = pBVar68;
        pBVar68[1] = (BBox1f)((long)pBVar68[1] + 1);
      }
      else {
        local_40 = local_40 + 1;
        (&local_240)[lVar66 * 2] = local_1798;
        (&local_238)[lVar66 * 2] = 1;
        local_2c8[local_248] = &local_240 + lVar66 * 2;
      }
      pBVar12 = pBVar68 + 1;
      *pBVar12 = (BBox1f)((long)*pBVar12 + -1);
      if ((*pBVar12 == (BBox1f)0x0) && (BVar6 = *pBVar68, BVar6 != (BBox1f)0x0)) {
        lVar66 = *(long *)((long)BVar6 + 0x18);
        pvVar61 = *(void **)((long)BVar6 + 0x20);
        if (pvVar61 != (void *)0x0) {
          if ((ulong)(lVar66 * 0x50) < 0x1c00000) {
            alignedFree(pvVar61);
          }
          else {
            os_free(pvVar61,lVar66 * 0x50,*(bool *)((long)BVar6 + 8));
          }
        }
        if (lVar66 != 0) {
          (**(code **)**(undefined8 **)BVar6)(*(undefined8 **)BVar6,lVar66 * -0x50,1);
        }
        *(undefined8 *)((long)BVar6 + 0x10) = 0;
        *(undefined8 *)((long)BVar6 + 0x18) = 0;
        *(undefined8 *)((long)BVar6 + 0x20) = 0;
        operator_delete((void *)BVar6);
      }
      (&lock)[uVar60 * 0xb].mutex = (MutexSys *)isLeft.split;
      *(vbool **)(local_db8 + uVar60 * 0xb0) = isLeft.vSplitMask;
      *(undefined8 *)(afStack_db0 + uVar60 * 0x2c) = uStack_1a50;
      *(undefined8 *)(local_da8 + uVar60 * 0xb0) = local_1a48._0_8_;
      *(undefined8 *)(afStack_da0 + uVar60 * 0x2c) = local_1a48._8_8_;
      *(undefined8 *)(local_d98 + uVar60 * 0xb0) = local_1a38._0_8_;
      *(undefined8 *)(afStack_d90 + uVar60 * 0x2c) = local_1a38._8_8_;
      *(undefined8 *)(local_d88 + uVar60 * 0xb0) = local_1a28._0_8_;
      *(undefined8 *)(afStack_d80 + uVar60 * 0x2c) = local_1a28._8_8_;
      *(BBox1f *)(local_d78 + uVar60 * 0xb0) = local_1a18;
      *(char (*) [8])(afStack_d70 + uVar60 * 0x2c) = acStack_1a10;
      (&local_d68)[uVar60 * 0x16] = local_1a08;
      (&pSStack_d60)[uVar60 * 0x16] = pSStack_1a00;
      local_d58[uVar60 * 0x16] = local_19f8;
      local_d58[uVar60 * 0x16 + 1] = BStack_19f0;
      *(ulong *)(local_d48 + uVar60 * 0x2c) = CONCAT44(uStack_19e4,local_19e8);
      (&uStack_d40)[uVar60 * 0x16] = CONCAT44(uStack_19dc,uStack_19e0);
      (&local_d38)[uVar60 * 0x16] = local_19d8;
      local_d28[uVar60 * 0x16 + -1] = BStack_19d0;
      local_d28[uVar60 * 0x16] = local_19c8;
      uVar70 = local_248;
      (&lock)[local_248 * 0xb].mutex = (MutexSys *)vSplitPos.field_0.v[0];
      *(undefined8 *)(local_db8 + uVar70 * 0xb0) = local_1828._0_8_;
      *(undefined8 *)(afStack_db0 + uVar70 * 0x2c) = local_1828._8_8_;
      *(intrusive_list_node **)(local_da8 + uVar70 * 0xb0) = local_1818;
      *(intrusive_list_node **)(afStack_da0 + uVar70 * 0x2c) = piStack_1810;
      *(__base_type *)(local_d98 + uVar70 * 0xb0) = local_1808._M_b._M_p;
      *(void **)(afStack_d90 + uVar70 * 0x2c) = pvStack_1800;
      *(string_resource_index *)(local_d88 + uVar70 * 0xb0) = local_17f8;
      *(undefined8 *)(afStack_d80 + uVar70 * 0x2c) = acStack_17f0._0_8_;
      *(undefined8 *)(local_d78 + uVar70 * 0xb0) = acStack_17f0._8_8_;
      *(undefined8 *)(afStack_d70 + uVar70 * 0x2c) = acStack_17f0._16_8_;
      (&local_d68)[uVar70 * 0x16] = local_17d8;
      (&pSStack_d60)[uVar70 * 0x16] = pSStack_17d0;
      local_d58[uVar70 * 0x16] = local_17c8;
      local_d58[uVar70 * 0x16 + 1] = BStack_17c0;
      local_d48[uVar70 * 0x2c] = local_17b8;
      local_d48[uVar70 * 0x2c + 1] = fStack_17b4;
      *(undefined4 *)(&uStack_d40 + uVar70 * 0x16) = uStack_17b0;
      *(undefined4 *)((long)&uStack_d40 + uVar70 * 0xb0 + 4) = uStack_17ac;
      (&local_d38)[uVar70 * 0x16].lower = (float)local_17a8;
      (&local_d38)[uVar70 * 0x16].upper = local_17a8._4_4_;
      local_d28[uVar70 * 0x16 + -1].lower = fStack_17a0;
      local_d28[uVar70 * 0x16 + -1].upper = fStack_179c;
      local_d28[uVar70 * 0x16] = local_1798;
      local_248 = local_248 + 1;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector_1._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector_1,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector_1._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar74 = (bool)(bVar74 | (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                )uVar20._M_t.
                                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                 .
                                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                 ._M_head_impl !=
                               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                )0x0);
    }
  } while (uVar60 != 0xffffffffffffffff);
  if (local_248 != 0) {
    pfVar62 = &fStack_d2c;
    uVar60 = local_248;
    do {
      bVar74 = (bool)(bVar74 | ((context->prims).super_PrimInfoMB.time_range.lower < pfVar62[-1] ||
                               *pfVar62 < (context->prims).super_PrimInfoMB.time_range.upper));
      pfVar62 = pfVar62 + 0x2c;
      uVar60 = uVar60 - 1;
    } while (uVar60 != 0);
  }
  if (!bVar74) {
    _reduction = (code *)0xe0;
    pTVar10 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      vSplitPos.field_0.v[1]._0_1_ = 1;
      vSplitPos.field_0.v[0] = (longlong)pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar10->alloc0).bytesUsed = 0;
      (pTVar10->alloc0).bytesWasted = 0;
      (pTVar10->alloc0).end = 0;
      (pTVar10->alloc0).allocBlockSize = 0;
      (pTVar10->alloc0).ptr = (char *)0x0;
      (pTVar10->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
      isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
      vSplitMask.field_0._0_8_ = pTVar10;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&vSplitMask);
      }
      else {
        *iVar11._M_current = (ThreadLocal2 *)vSplitMask.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if ((char)isLeft.vSplitPos == '\x01') {
        MutexSys::unlock((MutexSys *)isLeft.split);
      }
      if (vSplitPos.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)vSplitPos.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)_reduction;
    sVar64 = (alloc.talloc0)->cur;
    uVar60 = (ulong)(-(int)sVar64 & 0xf);
    uVar70 = sVar64 + (long)_reduction + uVar60;
    (alloc.talloc0)->cur = uVar70;
    if ((alloc.talloc0)->end < uVar70) {
      (alloc.talloc0)->cur = sVar64;
      if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
        pcVar72 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
      }
      else {
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar72 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar72;
        sVar64 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar64;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
          pcVar72 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
          (alloc.talloc0)->ptr = pcVar72;
          sVar64 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar64;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = (size_t)isLeft.split;
          (alloc.talloc0)->cur = (size_t)_reduction;
          if (isLeft.split < _reduction) {
            (alloc.talloc0)->cur = 0;
            pcVar72 = (char *)0x0;
            goto LAB_00d49508;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar64;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar60;
      pcVar72 = (alloc.talloc0)->ptr + (uVar70 - (long)_reduction);
    }
LAB_00d49508:
    pcVar72[0x60] = '\0';
    pcVar72[0x61] = '\0';
    pcVar72[0x62] = -0x80;
    pcVar72[99] = '\x7f';
    pcVar72[100] = '\0';
    pcVar72[0x65] = '\0';
    pcVar72[0x66] = -0x80;
    pcVar72[0x67] = '\x7f';
    pcVar72[0x68] = '\0';
    pcVar72[0x69] = '\0';
    pcVar72[0x6a] = -0x80;
    pcVar72[0x6b] = '\x7f';
    pcVar72[0x6c] = '\0';
    pcVar72[0x6d] = '\0';
    pcVar72[0x6e] = -0x80;
    pcVar72[0x6f] = '\x7f';
    pcVar72[0x40] = '\0';
    pcVar72[0x41] = '\0';
    pcVar72[0x42] = -0x80;
    pcVar72[0x43] = '\x7f';
    pcVar72[0x44] = '\0';
    pcVar72[0x45] = '\0';
    pcVar72[0x46] = -0x80;
    pcVar72[0x47] = '\x7f';
    pcVar72[0x48] = '\0';
    pcVar72[0x49] = '\0';
    pcVar72[0x4a] = -0x80;
    pcVar72[0x4b] = '\x7f';
    pcVar72[0x4c] = '\0';
    pcVar72[0x4d] = '\0';
    pcVar72[0x4e] = -0x80;
    pcVar72[0x4f] = '\x7f';
    pcVar72[0x20] = '\0';
    pcVar72[0x21] = '\0';
    pcVar72[0x22] = -0x80;
    pcVar72[0x23] = '\x7f';
    pcVar72[0x24] = '\0';
    pcVar72[0x25] = '\0';
    pcVar72[0x26] = -0x80;
    pcVar72[0x27] = '\x7f';
    pcVar72[0x28] = '\0';
    pcVar72[0x29] = '\0';
    pcVar72[0x2a] = -0x80;
    pcVar72[0x2b] = '\x7f';
    pcVar72[0x2c] = '\0';
    pcVar72[0x2d] = '\0';
    pcVar72[0x2e] = -0x80;
    pcVar72[0x2f] = '\x7f';
    pcVar72[0x70] = '\0';
    pcVar72[0x71] = '\0';
    pcVar72[0x72] = -0x80;
    pcVar72[0x73] = -1;
    pcVar72[0x74] = '\0';
    pcVar72[0x75] = '\0';
    pcVar72[0x76] = -0x80;
    pcVar72[0x77] = -1;
    pcVar72[0x78] = '\0';
    pcVar72[0x79] = '\0';
    pcVar72[0x7a] = -0x80;
    pcVar72[0x7b] = -1;
    pcVar72[0x7c] = '\0';
    pcVar72[0x7d] = '\0';
    pcVar72[0x7e] = -0x80;
    pcVar72[0x7f] = -1;
    pcVar72[0x50] = '\0';
    pcVar72[0x51] = '\0';
    pcVar72[0x52] = -0x80;
    pcVar72[0x53] = -1;
    pcVar72[0x54] = '\0';
    pcVar72[0x55] = '\0';
    pcVar72[0x56] = -0x80;
    pcVar72[0x57] = -1;
    pcVar72[0x58] = '\0';
    pcVar72[0x59] = '\0';
    pcVar72[0x5a] = -0x80;
    pcVar72[0x5b] = -1;
    pcVar72[0x5c] = '\0';
    pcVar72[0x5d] = '\0';
    pcVar72[0x5e] = -0x80;
    pcVar72[0x5f] = -1;
    pcVar72[0x30] = '\0';
    pcVar72[0x31] = '\0';
    pcVar72[0x32] = -0x80;
    pcVar72[0x33] = -1;
    pcVar72[0x34] = '\0';
    pcVar72[0x35] = '\0';
    pcVar72[0x36] = -0x80;
    pcVar72[0x37] = -1;
    pcVar72[0x38] = '\0';
    pcVar72[0x39] = '\0';
    pcVar72[0x3a] = -0x80;
    pcVar72[0x3b] = -1;
    pcVar72[0x3c] = '\0';
    pcVar72[0x3d] = '\0';
    pcVar72[0x3e] = -0x80;
    pcVar72[0x3f] = -1;
    pcVar72[0x80] = '\0';
    pcVar72[0x81] = '\0';
    pcVar72[0x82] = '\0';
    pcVar72[0x83] = '\0';
    pcVar72[0x84] = '\0';
    pcVar72[0x85] = '\0';
    pcVar72[0x86] = '\0';
    pcVar72[0x87] = '\0';
    pcVar72[0x88] = '\0';
    pcVar72[0x89] = '\0';
    pcVar72[0x8a] = '\0';
    pcVar72[0x8b] = '\0';
    pcVar72[0x8c] = '\0';
    pcVar72[0x8d] = '\0';
    pcVar72[0x8e] = '\0';
    pcVar72[0x8f] = '\0';
    pcVar72[0x90] = '\0';
    pcVar72[0x91] = '\0';
    pcVar72[0x92] = '\0';
    pcVar72[0x93] = '\0';
    pcVar72[0x94] = '\0';
    pcVar72[0x95] = '\0';
    pcVar72[0x96] = '\0';
    pcVar72[0x97] = '\0';
    pcVar72[0x98] = '\0';
    pcVar72[0x99] = '\0';
    pcVar72[0x9a] = '\0';
    pcVar72[0x9b] = '\0';
    pcVar72[0x9c] = '\0';
    pcVar72[0x9d] = '\0';
    pcVar72[0x9e] = '\0';
    pcVar72[0x9f] = '\0';
    pcVar72[0xa0] = '\0';
    pcVar72[0xa1] = '\0';
    pcVar72[0xa2] = '\0';
    pcVar72[0xa3] = '\0';
    pcVar72[0xa4] = '\0';
    pcVar72[0xa5] = '\0';
    pcVar72[0xa6] = '\0';
    pcVar72[0xa7] = '\0';
    pcVar72[0xa8] = '\0';
    pcVar72[0xa9] = '\0';
    pcVar72[0xaa] = '\0';
    pcVar72[0xab] = '\0';
    pcVar72[0xac] = '\0';
    pcVar72[0xad] = '\0';
    pcVar72[0xae] = '\0';
    pcVar72[0xaf] = '\0';
    pcVar72[0xb0] = '\0';
    pcVar72[0xb1] = '\0';
    pcVar72[0xb2] = '\0';
    pcVar72[0xb3] = '\0';
    pcVar72[0xb4] = '\0';
    pcVar72[0xb5] = '\0';
    pcVar72[0xb6] = '\0';
    pcVar72[0xb7] = '\0';
    pcVar72[0xb8] = '\0';
    pcVar72[0xb9] = '\0';
    pcVar72[0xba] = '\0';
    pcVar72[0xbb] = '\0';
    pcVar72[0xbc] = '\0';
    pcVar72[0xbd] = '\0';
    pcVar72[0xbe] = '\0';
    pcVar72[0xbf] = '\0';
    pcVar72[0xc0] = '\0';
    pcVar72[0xc1] = '\0';
    pcVar72[0xc2] = '\0';
    pcVar72[0xc3] = '\0';
    pcVar72[0xc4] = '\0';
    pcVar72[0xc5] = '\0';
    pcVar72[0xc6] = '\0';
    pcVar72[199] = '\0';
    pcVar72[200] = '\0';
    pcVar72[0xc9] = '\0';
    pcVar72[0xca] = '\0';
    pcVar72[0xcb] = '\0';
    pcVar72[0xcc] = '\0';
    pcVar72[0xcd] = '\0';
    pcVar72[0xce] = '\0';
    pcVar72[0xcf] = '\0';
    pcVar72[0xd0] = '\0';
    pcVar72[0xd1] = '\0';
    pcVar72[0xd2] = '\0';
    pcVar72[0xd3] = '\0';
    pcVar72[0xd4] = '\0';
    pcVar72[0xd5] = '\0';
    pcVar72[0xd6] = '\0';
    pcVar72[0xd7] = '\0';
    pcVar72[0xd8] = '\0';
    pcVar72[0xd9] = '\0';
    pcVar72[0xda] = '\0';
    pcVar72[0xdb] = '\0';
    pcVar72[0xdc] = '\0';
    pcVar72[0xdd] = '\0';
    pcVar72[0xde] = '\0';
    pcVar72[0xdf] = '\0';
    lVar66 = 0;
    do {
      pcVar3 = pcVar72 + lVar66 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\b';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      lVar66 = lVar66 + 2;
    } while (lVar66 != 4);
    uVar60 = 1;
    goto LAB_00d4958a;
  }
  _reduction = (code *)0x100;
  pTVar10 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
    vSplitPos.field_0.v[1]._0_1_ = 1;
    vSplitPos.field_0.v[0] = (longlong)pTVar10;
    MutexSys::lock(&pTVar10->mutex);
    if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
           ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar10->alloc0).bytesUsed = 0;
    (pTVar10->alloc0).bytesWasted = 0;
    (pTVar10->alloc0).end = 0;
    (pTVar10->alloc0).allocBlockSize = 0;
    (pTVar10->alloc0).ptr = (char *)0x0;
    (pTVar10->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
    }
    else {
      (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar10->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
    isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
    vSplitMask.field_0._0_8_ = pTVar10;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar11._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&vSplitMask);
    }
    else {
      *iVar11._M_current = (ThreadLocal2 *)vSplitMask.field_0._0_8_;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if ((char)isLeft.vSplitPos == '\x01') {
      MutexSys::unlock((MutexSys *)isLeft.split);
    }
    if (vSplitPos.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)vSplitPos.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)_reduction;
  sVar64 = (alloc.talloc0)->cur;
  uVar60 = (ulong)(-(int)sVar64 & 0xf);
  uVar70 = sVar64 + (long)_reduction + uVar60;
  (alloc.talloc0)->cur = uVar70;
  if ((alloc.talloc0)->end < uVar70) {
    (alloc.talloc0)->cur = sVar64;
    if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
      pcVar72 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
    }
    else {
      isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
      pcVar72 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
      (alloc.talloc0)->ptr = pcVar72;
      sVar64 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar64;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = (size_t)isLeft.split;
      (alloc.talloc0)->cur = (size_t)_reduction;
      if (isLeft.split < _reduction) {
        (alloc.talloc0)->cur = 0;
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar72 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar72;
        sVar64 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar64;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          pcVar72 = (char *)0x0;
          goto LAB_00d493f2;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar64;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar60;
    pcVar72 = (alloc.talloc0)->ptr + (uVar70 - (long)_reduction);
  }
LAB_00d493f2:
  pcVar72[0xe0] = '\0';
  pcVar72[0xe1] = '\0';
  pcVar72[0xe2] = -0x80;
  pcVar72[0xe3] = '\x7f';
  pcVar72[0xe4] = '\0';
  pcVar72[0xe5] = '\0';
  pcVar72[0xe6] = -0x80;
  pcVar72[0xe7] = '\x7f';
  pcVar72[0xe8] = '\0';
  pcVar72[0xe9] = '\0';
  pcVar72[0xea] = -0x80;
  pcVar72[0xeb] = '\x7f';
  pcVar72[0xec] = '\0';
  pcVar72[0xed] = '\0';
  pcVar72[0xee] = -0x80;
  pcVar72[0xef] = '\x7f';
  pcVar72[0xf0] = '\0';
  pcVar72[0xf1] = '\0';
  pcVar72[0xf2] = -0x80;
  pcVar72[0xf3] = -1;
  pcVar72[0xf4] = '\0';
  pcVar72[0xf5] = '\0';
  pcVar72[0xf6] = -0x80;
  pcVar72[0xf7] = -1;
  pcVar72[0xf8] = '\0';
  pcVar72[0xf9] = '\0';
  pcVar72[0xfa] = -0x80;
  pcVar72[0xfb] = -1;
  pcVar72[0xfc] = '\0';
  pcVar72[0xfd] = '\0';
  pcVar72[0xfe] = -0x80;
  pcVar72[0xff] = -1;
  pcVar72[0x60] = '\0';
  pcVar72[0x61] = '\0';
  pcVar72[0x62] = -0x80;
  pcVar72[99] = '\x7f';
  pcVar72[100] = '\0';
  pcVar72[0x65] = '\0';
  pcVar72[0x66] = -0x80;
  pcVar72[0x67] = '\x7f';
  pcVar72[0x68] = '\0';
  pcVar72[0x69] = '\0';
  pcVar72[0x6a] = -0x80;
  pcVar72[0x6b] = '\x7f';
  pcVar72[0x6c] = '\0';
  pcVar72[0x6d] = '\0';
  pcVar72[0x6e] = -0x80;
  pcVar72[0x6f] = '\x7f';
  pcVar72[0x40] = '\0';
  pcVar72[0x41] = '\0';
  pcVar72[0x42] = -0x80;
  pcVar72[0x43] = '\x7f';
  pcVar72[0x44] = '\0';
  pcVar72[0x45] = '\0';
  pcVar72[0x46] = -0x80;
  pcVar72[0x47] = '\x7f';
  pcVar72[0x48] = '\0';
  pcVar72[0x49] = '\0';
  pcVar72[0x4a] = -0x80;
  pcVar72[0x4b] = '\x7f';
  pcVar72[0x4c] = '\0';
  pcVar72[0x4d] = '\0';
  pcVar72[0x4e] = -0x80;
  pcVar72[0x4f] = '\x7f';
  pcVar72[0x20] = '\0';
  pcVar72[0x21] = '\0';
  pcVar72[0x22] = -0x80;
  pcVar72[0x23] = '\x7f';
  pcVar72[0x24] = '\0';
  pcVar72[0x25] = '\0';
  pcVar72[0x26] = -0x80;
  pcVar72[0x27] = '\x7f';
  pcVar72[0x28] = '\0';
  pcVar72[0x29] = '\0';
  pcVar72[0x2a] = -0x80;
  pcVar72[0x2b] = '\x7f';
  pcVar72[0x2c] = '\0';
  pcVar72[0x2d] = '\0';
  pcVar72[0x2e] = -0x80;
  pcVar72[0x2f] = '\x7f';
  pcVar72[0x70] = '\0';
  pcVar72[0x71] = '\0';
  pcVar72[0x72] = -0x80;
  pcVar72[0x73] = -1;
  pcVar72[0x74] = '\0';
  pcVar72[0x75] = '\0';
  pcVar72[0x76] = -0x80;
  pcVar72[0x77] = -1;
  pcVar72[0x78] = '\0';
  pcVar72[0x79] = '\0';
  pcVar72[0x7a] = -0x80;
  pcVar72[0x7b] = -1;
  pcVar72[0x7c] = '\0';
  pcVar72[0x7d] = '\0';
  pcVar72[0x7e] = -0x80;
  pcVar72[0x7f] = -1;
  pcVar72[0x50] = '\0';
  pcVar72[0x51] = '\0';
  pcVar72[0x52] = -0x80;
  pcVar72[0x53] = -1;
  pcVar72[0x54] = '\0';
  pcVar72[0x55] = '\0';
  pcVar72[0x56] = -0x80;
  pcVar72[0x57] = -1;
  pcVar72[0x58] = '\0';
  pcVar72[0x59] = '\0';
  pcVar72[0x5a] = -0x80;
  pcVar72[0x5b] = -1;
  pcVar72[0x5c] = '\0';
  pcVar72[0x5d] = '\0';
  pcVar72[0x5e] = -0x80;
  pcVar72[0x5f] = -1;
  pcVar72[0x30] = '\0';
  pcVar72[0x31] = '\0';
  pcVar72[0x32] = -0x80;
  pcVar72[0x33] = -1;
  pcVar72[0x34] = '\0';
  pcVar72[0x35] = '\0';
  pcVar72[0x36] = -0x80;
  pcVar72[0x37] = -1;
  pcVar72[0x38] = '\0';
  pcVar72[0x39] = '\0';
  pcVar72[0x3a] = -0x80;
  pcVar72[0x3b] = -1;
  pcVar72[0x3c] = '\0';
  pcVar72[0x3d] = '\0';
  pcVar72[0x3e] = -0x80;
  pcVar72[0x3f] = -1;
  pcVar72[0x80] = '\0';
  pcVar72[0x81] = '\0';
  pcVar72[0x82] = '\0';
  pcVar72[0x83] = '\0';
  pcVar72[0x84] = '\0';
  pcVar72[0x85] = '\0';
  pcVar72[0x86] = '\0';
  pcVar72[0x87] = '\0';
  pcVar72[0x88] = '\0';
  pcVar72[0x89] = '\0';
  pcVar72[0x8a] = '\0';
  pcVar72[0x8b] = '\0';
  pcVar72[0x8c] = '\0';
  pcVar72[0x8d] = '\0';
  pcVar72[0x8e] = '\0';
  pcVar72[0x8f] = '\0';
  pcVar72[0x90] = '\0';
  pcVar72[0x91] = '\0';
  pcVar72[0x92] = '\0';
  pcVar72[0x93] = '\0';
  pcVar72[0x94] = '\0';
  pcVar72[0x95] = '\0';
  pcVar72[0x96] = '\0';
  pcVar72[0x97] = '\0';
  pcVar72[0x98] = '\0';
  pcVar72[0x99] = '\0';
  pcVar72[0x9a] = '\0';
  pcVar72[0x9b] = '\0';
  pcVar72[0x9c] = '\0';
  pcVar72[0x9d] = '\0';
  pcVar72[0x9e] = '\0';
  pcVar72[0x9f] = '\0';
  pcVar72[0xa0] = '\0';
  pcVar72[0xa1] = '\0';
  pcVar72[0xa2] = '\0';
  pcVar72[0xa3] = '\0';
  pcVar72[0xa4] = '\0';
  pcVar72[0xa5] = '\0';
  pcVar72[0xa6] = '\0';
  pcVar72[0xa7] = '\0';
  pcVar72[0xa8] = '\0';
  pcVar72[0xa9] = '\0';
  pcVar72[0xaa] = '\0';
  pcVar72[0xab] = '\0';
  pcVar72[0xac] = '\0';
  pcVar72[0xad] = '\0';
  pcVar72[0xae] = '\0';
  pcVar72[0xaf] = '\0';
  pcVar72[0xb0] = '\0';
  pcVar72[0xb1] = '\0';
  pcVar72[0xb2] = '\0';
  pcVar72[0xb3] = '\0';
  pcVar72[0xb4] = '\0';
  pcVar72[0xb5] = '\0';
  pcVar72[0xb6] = '\0';
  pcVar72[0xb7] = '\0';
  pcVar72[0xb8] = '\0';
  pcVar72[0xb9] = '\0';
  pcVar72[0xba] = '\0';
  pcVar72[0xbb] = '\0';
  pcVar72[0xbc] = '\0';
  pcVar72[0xbd] = '\0';
  pcVar72[0xbe] = '\0';
  pcVar72[0xbf] = '\0';
  pcVar72[0xc0] = '\0';
  pcVar72[0xc1] = '\0';
  pcVar72[0xc2] = '\0';
  pcVar72[0xc3] = '\0';
  pcVar72[0xc4] = '\0';
  pcVar72[0xc5] = '\0';
  pcVar72[0xc6] = '\0';
  pcVar72[199] = '\0';
  pcVar72[200] = '\0';
  pcVar72[0xc9] = '\0';
  pcVar72[0xca] = '\0';
  pcVar72[0xcb] = '\0';
  pcVar72[0xcc] = '\0';
  pcVar72[0xcd] = '\0';
  pcVar72[0xce] = '\0';
  pcVar72[0xcf] = '\0';
  pcVar72[0xd0] = '\0';
  pcVar72[0xd1] = '\0';
  pcVar72[0xd2] = '\0';
  pcVar72[0xd3] = '\0';
  pcVar72[0xd4] = '\0';
  pcVar72[0xd5] = '\0';
  pcVar72[0xd6] = '\0';
  pcVar72[0xd7] = '\0';
  pcVar72[0xd8] = '\0';
  pcVar72[0xd9] = '\0';
  pcVar72[0xda] = '\0';
  pcVar72[0xdb] = '\0';
  pcVar72[0xdc] = '\0';
  pcVar72[0xdd] = '\0';
  pcVar72[0xde] = '\0';
  pcVar72[0xdf] = '\0';
  lVar66 = 0;
  do {
    pcVar3 = pcVar72 + lVar66 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\b';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    lVar66 = lVar66 + 2;
  } while (lVar66 != 4);
  uVar60 = 6;
LAB_00d4958a:
  uVar70 = local_248;
  if ((this->cfg).singleThreadThreshold <
      (context->prims).super_PrimInfoMB.object_range._end -
      (context->prims).super_PrimInfoMB.object_range._begin) {
    vSplitMask.field_0._0_8_ = values;
    local_18c8._0_8_ = &lock;
    isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
    vSplitMask.field_0._8_8_ = this;
    tbb::detail::r1::initialize((task_group_context *)&isLeft);
    vSplitPos.field_0.v[0] = uVar70;
    vSplitPos.field_0.v[1] = 0;
    local_1828._0_8_ = (BBox1f *)0x1;
    _reduction = (code *)&vSplitMask;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&vSplitPos,(anon_class_8_1_898bcfc2 *)&reduction,
          (auto_partitioner *)&reduction2,(task_group_context *)&isLeft);
    cVar57 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
    if (cVar57 != '\0') {
      prVar65 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar65,"task cancelled");
      __cxa_throw(prVar65,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&isLeft);
    local_1ac8._8_8_ = 0xff800000ff800000;
    local_1ac8._0_8_ = 0xff800000ff800000;
    local_1ab8._8_8_ = 0x7f8000007f800000;
    local_1ab8._0_8_ = 0x7f8000007f800000;
    if (local_248 != 0) {
      paVar67 = &values[0].lbounds.bounds1.upper.field_0;
      local_1ab8._8_8_ = 0x7f8000007f800000;
      local_1ab8._0_8_ = 0x7f8000007f800000;
      local_1a88._8_8_ = 0x7f8000007f800000;
      local_1a88._0_8_ = 0x7f8000007f800000;
      local_1ac8._8_8_ = 0xff800000ff800000;
      local_1ac8._0_8_ = 0xff800000ff800000;
      local_1a98._8_8_ = 0xff800000ff800000;
      local_1a98._0_8_ = 0xff800000ff800000;
      uVar70 = local_248;
      do {
        local_1ab8 = minps(local_1ab8,(undefined1  [16])paVar67[-3]);
        local_1ac8 = maxps(local_1ac8,(undefined1  [16])paVar67[-2]);
        local_1a88 = minps(local_1a88,*(undefined1 (*) [16])&paVar67[-1].field_1.x);
        local_1a98 = maxps(local_1a98,(undefined1  [16])*paVar67);
        paVar67 = paVar67 + 6;
        uVar70 = uVar70 - 1;
      } while (uVar70 != 0);
    }
  }
  else {
    local_1ac8._8_8_ = 0xff800000ff800000;
    local_1ac8._0_8_ = 0xff800000ff800000;
    local_1ab8._8_8_ = 0x7f8000007f800000;
    local_1ab8._0_8_ = 0x7f8000007f800000;
    if (-1 < (long)(local_248 - 1)) {
      pBVar68 = &values[local_248 - 1].dt;
      pBVar92 = (BuildRecord *)&(&lock)[local_248 * 0xb].mutex;
      local_1ab8._8_8_ = 0x7f8000007f800000;
      local_1ab8._0_8_ = 0x7f8000007f800000;
      local_1a88._8_8_ = 0x7f8000007f800000;
      local_1a88._0_8_ = 0x7f8000007f800000;
      local_1ac8._8_8_ = 0xff800000ff800000;
      local_1ac8._0_8_ = 0xff800000ff800000;
      local_1a98._8_8_ = 0xff800000ff800000;
      local_1a98._0_8_ = 0xff800000ff800000;
      do {
        pBVar92 = pBVar92 + -1;
        alloc_01.talloc0 = alloc.talloc0;
        alloc_01.alloc = alloc.alloc;
        alloc_01.talloc1 = alloc.talloc1;
        recurse((NodeRecordMB4D *)&isLeft,this,pBVar92,alloc_01,false);
        (((NodeRecordMB4D *)(pBVar68 + -10))->ref).ptr = (size_t)isLeft.split;
        aVar18._8_8_ = uStack_1a50;
        aVar18._0_8_ = isLeft.vSplitMask;
        (((LBBox3fa *)(pBVar68 + -8))->bounds0).lower.field_0 = aVar18;
        *(undefined8 *)&((Vec3fa *)(pBVar68 + -6))->field_0 = local_1a48._0_8_;
        *(undefined8 *)((long)&((Vec3fa *)(pBVar68 + -6))->field_0 + 8) = local_1a48._8_8_;
        *(undefined8 *)&(((BBox<embree::Vec3fa> *)(pBVar68 + -4))->lower).field_0 = local_1a38._0_8_
        ;
        *(undefined8 *)((long)&(((BBox<embree::Vec3fa> *)(pBVar68 + -4))->lower).field_0 + 8) =
             local_1a38._8_8_;
        *(undefined8 *)&((Vec3fa *)(pBVar68 + -2))->field_0 = local_1a28._0_8_;
        *(undefined8 *)((long)&((Vec3fa *)(pBVar68 + -2))->field_0 + 8) = local_1a28._8_8_;
        *(BBox1f *)&pBVar68->lower = local_1a18;
        local_1ab8 = minps(local_1ab8,(undefined1  [16])aVar18);
        local_1ac8 = maxps(local_1ac8,
                           (undefined1  [16])
                           *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar68 + -6));
        local_1a88 = minps(local_1a88,
                           (undefined1  [16])
                           (((BBox<embree::Vec3fa> *)(pBVar68 + -4))->lower).field_0);
        local_1a98 = maxps(local_1a98,
                           (undefined1  [16])
                           *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar68 + -2));
        uVar70 = uVar70 - 1;
        pBVar68 = pBVar68 + -0xc;
      } while (0 < (long)uVar70);
    }
  }
  auVar19 = _DAT_01ff1820;
  auVar77 = _DAT_01ff1810;
  uVar60 = uVar60 | (ulong)pcVar72;
  if (((uint)uVar60 & 0xf) == 1) {
    if (local_248 != 0) {
      uVar73 = (ulong)pcVar72 & 0xfffffffffffffff0;
      pfVar62 = &values[0].dt.upper;
      uVar70 = 0;
      do {
        *(undefined8 *)(uVar73 + uVar70 * 8) = *(undefined8 *)(pfVar62 + -0x15);
        fVar89 = ((BBox1f *)(pfVar62 + -1))->lower;
        fVar79 = 1.0 / (*pfVar62 - fVar89);
        fVar80 = -fVar89 * fVar79;
        fVar78 = 1.0 - fVar80;
        auVar87._0_4_ = pfVar62[-0x11] * fVar78 + pfVar62[-9] * fVar80;
        auVar87._4_4_ = pfVar62[-0x10] * fVar78 + pfVar62[-8] * fVar80;
        auVar87._8_4_ = pfVar62[-0xf] * fVar78 + pfVar62[-7] * fVar80;
        auVar87._12_4_ = pfVar62[-0xe] * fVar78 + pfVar62[-6] * fVar80;
        auVar88._0_4_ = fVar78 * pfVar62[-0xd] + fVar80 * pfVar62[-5];
        auVar88._4_4_ = fVar78 * pfVar62[-0xc] + fVar80 * pfVar62[-4];
        auVar88._8_4_ = fVar78 * pfVar62[-0xb] + fVar80 * pfVar62[-3];
        auVar88._12_4_ = fVar78 * pfVar62[-10] + fVar80 * pfVar62[-2];
        fVar79 = (1.0 - fVar89) * fVar79;
        fVar89 = 1.0 - fVar79;
        auVar86._0_4_ = pfVar62[-0x11] * fVar89 + pfVar62[-9] * fVar79;
        auVar86._4_4_ = pfVar62[-0x10] * fVar89 + pfVar62[-8] * fVar79;
        auVar86._8_4_ = pfVar62[-0xf] * fVar89 + pfVar62[-7] * fVar79;
        auVar86._12_4_ = pfVar62[-0xe] * fVar89 + pfVar62[-6] * fVar79;
        auVar90._0_4_ = fVar89 * pfVar62[-0xd] + fVar79 * pfVar62[-5];
        auVar90._4_4_ = fVar89 * pfVar62[-0xc] + fVar79 * pfVar62[-4];
        auVar90._8_4_ = fVar89 * pfVar62[-0xb] + fVar79 * pfVar62[-3];
        auVar90._12_4_ = fVar89 * pfVar62[-10] + fVar79 * pfVar62[-2];
        auVar87 = minps(auVar87,auVar19);
        auVar88 = maxps(auVar88,auVar77);
        auVar86 = minps(auVar86,auVar19);
        auVar90 = maxps(auVar90,auVar77);
        fVar89 = auVar87._0_4_ - ABS(auVar87._0_4_) * 4.7683716e-07;
        fVar78 = auVar87._4_4_ - ABS(auVar87._4_4_) * 4.7683716e-07;
        fVar79 = auVar87._8_4_ - ABS(auVar87._8_4_) * 4.7683716e-07;
        fVar80 = ABS(auVar88._0_4_) * 4.7683716e-07 + auVar88._0_4_;
        fVar81 = ABS(auVar88._4_4_) * 4.7683716e-07 + auVar88._4_4_;
        fVar91 = ABS(auVar88._8_4_) * 4.7683716e-07 + auVar88._8_4_;
        *(float *)(uVar73 + 0x20 + uVar70 * 4) = fVar89;
        *(float *)(uVar73 + 0x40 + uVar70 * 4) = fVar78;
        *(float *)(uVar73 + 0x60 + uVar70 * 4) = fVar79;
        *(float *)(uVar73 + 0x30 + uVar70 * 4) = fVar80;
        *(float *)(uVar73 + 0x50 + uVar70 * 4) = fVar81;
        *(float *)(uVar73 + 0x70 + uVar70 * 4) = fVar91;
        *(float *)(uVar73 + 0x80 + uVar70 * 4) =
             (auVar86._0_4_ - ABS(auVar86._0_4_) * 4.7683716e-07) - fVar89;
        *(float *)(uVar73 + 0xa0 + uVar70 * 4) =
             (auVar86._4_4_ - ABS(auVar86._4_4_) * 4.7683716e-07) - fVar78;
        *(float *)(uVar73 + 0xc0 + uVar70 * 4) =
             (auVar86._8_4_ - ABS(auVar86._8_4_) * 4.7683716e-07) - fVar79;
        *(float *)(uVar73 + 0x90 + uVar70 * 4) =
             (ABS(auVar90._0_4_) * 4.7683716e-07 + auVar90._0_4_) - fVar80;
        *(float *)(uVar73 + 0xb0 + uVar70 * 4) =
             (ABS(auVar90._4_4_) * 4.7683716e-07 + auVar90._4_4_) - fVar81;
        *(float *)(uVar73 + 0xd0 + uVar70 * 4) =
             (ABS(auVar90._8_4_) * 4.7683716e-07 + auVar90._8_4_) - fVar91;
        uVar70 = uVar70 + 1;
        pfVar62 = pfVar62 + 0x18;
      } while (local_248 != uVar70);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::sse2::RecalculatePrimRef<embree::UserGeometry>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::CreateMSMBlurLeaf<4,embree::UserGeometry,embree::Object>,embree::Scene::BuildProgressMonitorInterface>
    ::recurse();
  }
  if (bVar74) {
    vSplitPos_1.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    pSVar13 = (Split *)(context->prims).super_PrimInfoMB.object_range._begin;
    pSVar14 = (Split *)(context->prims).super_PrimInfoMB.object_range._end;
    vSplitPos.field_0.v[0] = 0x7f8000007f800000;
    vSplitPos.field_0.v[1] = 0x7f8000007f800000;
    local_1828._0_8_ = (BBox1f *)0xff800000ff800000;
    local_1828._8_8_ = 0xff800000ff800000;
    local_1818 = (intrusive_list_node *)0x7f8000007f800000;
    piStack_1810 = (intrusive_list_node *)0x7f8000007f800000;
    local_1808._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
    pvStack_1800 = (void *)0xff800000ff800000;
    vSplitPos_1.field_0.v[0] = (longlong)set;
    if ((ulong)((long)pSVar14 - (long)pSVar13) < 0xc00) {
      isLeft.split = pSVar13;
      isLeft.vSplitPos = (vint *)pSVar14;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vSplitMask,(anon_class_16_2_aeee9775 *)&vSplitPos_1,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      isLeft.vSplitPos._0_6_ = CONCAT24(0x401,isLeft.vSplitPos._0_4_);
      tbb::detail::r1::initialize((task_group_context *)&isLeft);
      _reduction2 = &time_range0;
      _reduction = (code *)pSVar14;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::UserGeometry>>(embree::sse2::RecalculatePrimRef<embree::UserGeometry>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vSplitMask,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&vSplitPos,(LBBox<embree::Vec3fa> *)&reduction2,
                 (anon_class_16_2_ed117de8_conflict31 *)_reduction2,
                 (anon_class_1_0_00000001 *)&isLeft,(task_group_context *)context);
      cVar57 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar57 != '\0') {
        prVar65 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar65,"task cancelled");
        __cxa_throw(prVar65,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&isLeft);
    }
    (__return_storage_ptr__->ref).ptr = uVar60;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         vSplitMask.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         vSplitMask.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_18c8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_18c8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_18b8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_18b8._8_8_;
    local_1a98._0_8_ = local_18a8._0_8_;
    local_1a98._8_8_ = local_18a8._8_8_;
  }
  else {
    (__return_storage_ptr__->ref).ptr = uVar60;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1ab8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1ab8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1ac8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1ac8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1a88._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1a88._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1a98._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1a98._8_8_;
  __return_storage_ptr__->dt = (context->prims).super_PrimInfoMB.time_range;
  if (local_248 != 0) {
    uVar60 = 0;
    do {
      pBVar12 = local_2c8[uVar60];
      pBVar68 = pBVar12 + 1;
      *pBVar68 = (BBox1f)((long)*pBVar68 + -1);
      if ((*pBVar68 == (BBox1f)0x0) && (BVar6 = *pBVar12, BVar6 != (BBox1f)0x0)) {
        lVar66 = *(long *)((long)BVar6 + 0x18);
        pvVar61 = *(void **)((long)BVar6 + 0x20);
        if (pvVar61 != (void *)0x0) {
          if ((ulong)(lVar66 * 0x50) < 0x1c00000) {
            alignedFree(pvVar61);
          }
          else {
            os_free(pvVar61,lVar66 * 0x50,*(bool *)((long)BVar6 + 8));
          }
        }
        if (lVar66 != 0) {
          (**(code **)**(undefined8 **)BVar6)(*(undefined8 **)BVar6,lVar66 * -0x50,1);
        }
        *(undefined8 *)((long)BVar6 + 0x10) = 0;
        *(undefined8 *)((long)BVar6 + 0x18) = 0;
        *(undefined8 *)((long)BVar6 + 0x20) = 0;
        operator_delete((void *)BVar6);
      }
      uVar60 = uVar60 + 1;
    } while (uVar60 < local_248);
  }
  if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       )new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       )0x0) {
    std::
    default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
    ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                  *)&new_vector,
                 (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  *)new_vector._M_t.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D recurse(const BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            const Split csplit = find(current.prims);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*current.prims.halfArea()+cfg.intCost*csplit.splitSAH();
            assert((current.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              current.prims.deterministic_order();
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            SetMB lprims,rprims;
            std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,current.prims,lprims,rprims);
            bool hasTimeSplits = new_vector != nullptr;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildList children(current);
            {
              BuildRecord lrecord(lprims,current.depth+1);
              BuildRecord rrecord(rprims,current.depth+1);
              children.split(0,lrecord,rrecord,std::move(new_vector));
            }

            /*! split until node is full or SAH tells us to stop */
            while (children.size() < cfg.branchingFactor) 
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<children.size(); i++)
              {
                if (children[i].size() <= cfg.minLeafSize) continue;
                if (expectedApproxHalfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i; bestArea = expectedApproxHalfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              Split csplit = find(brecord.prims);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));
            }

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = current.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* sort buildrecords for simpler shadow ray traversal */
            //std::sort(&children[0],&children[children.size()],std::greater<BuildRecord>()); // FIXME: reduces traversal performance of bvh8.triangle4 (need to verified) !!

            /*! create an inner node */
            auto node = createNode(children.children.data(), children.numChildren, alloc, hasTimeSplits);
            LBBox3fa gbounds = empty;

            /* spawn tasks */
            if (unlikely(current.size() > cfg.singleThreadThreshold))
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), children.size(), [&] (const range<size_t>& r) {
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              /*! merge bounding boxes */
              for (size_t i=0; i<children.size(); i++)
                gbounds.extend(values[i].lbounds);
            }
            /* recurse into each child */
            else
            {
              //for (size_t i=0; i<children.size(); i++)
              for (ssize_t i=children.size()-1; i>=0; i--) {
                values[i] = recurse(children[i],alloc,false);
                gbounds.extend(values[i].lbounds);
              }
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (unlikely(hasTimeSplits))
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }